

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  ulong uVar55;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar56;
  byte bVar57;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ulong uVar58;
  byte bVar59;
  ulong uVar60;
  undefined8 unaff_R13;
  ulong uVar61;
  bool bVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  uint uVar65;
  uint uVar128;
  uint uVar129;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  uint uVar130;
  uint uVar134;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar127 [32];
  float pp;
  float fVar135;
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar151;
  float fVar152;
  undefined4 uVar153;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar218 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [32];
  undefined1 auVar222 [16];
  undefined1 auVar226 [32];
  undefined1 auVar224 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  undefined1 auVar236 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [28];
  undefined1 auVar241 [64];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar251 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  float fVar248;
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar252 [64];
  undefined1 in_ZMM31 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cdc;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [64];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  
  uVar55 = (ulong)(byte)prim[1];
  fVar248 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar68 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar75 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar76 = vsubps_avx(auVar68,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  fVar199 = fVar248 * auVar76._0_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar55 * 4 + 6);
  auVar84 = vpmovsxbd_avx2(auVar68);
  fVar135 = fVar248 * auVar75._0_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar55 * 5 + 6);
  auVar82 = vpmovsxbd_avx2(auVar11);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar55 * 6 + 6);
  auVar85 = vpmovsxbd_avx2(auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar55 * 0xb + 6);
  auVar86 = vpmovsxbd_avx2(auVar70);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar55 * 0xc + 6);
  auVar87 = vpmovsxbd_avx2(auVar66);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar55 * 0xd + 6);
  auVar83 = vpmovsxbd_avx2(auVar74);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar55 * 0x12 + 6);
  auVar88 = vpmovsxbd_avx2(auVar71);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar55 * 0x13 + 6);
  auVar89 = vpmovsxbd_avx2(auVar67);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar55 * 0x14 + 6);
  auVar91 = vpmovsxbd_avx2(auVar72);
  auVar90 = vcvtdq2ps_avx(auVar91);
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  auVar100._4_4_ = fVar135;
  auVar100._0_4_ = fVar135;
  auVar100._8_4_ = fVar135;
  auVar100._12_4_ = fVar135;
  auVar100._16_4_ = fVar135;
  auVar100._20_4_ = fVar135;
  auVar100._24_4_ = fVar135;
  auVar100._28_4_ = fVar135;
  auVar81 = ZEXT1632(CONCAT412(fVar248 * auVar75._12_4_,
                               CONCAT48(fVar248 * auVar75._8_4_,
                                        CONCAT44(fVar248 * auVar75._4_4_,fVar135))));
  auVar92 = vpermps_avx2(auVar102,auVar81);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar80 = vpermps_avx512vl(auVar79,auVar81);
  fVar135 = auVar80._0_4_;
  auVar150._0_4_ = fVar135 * auVar85._0_4_;
  fVar151 = auVar80._4_4_;
  auVar150._4_4_ = fVar151 * auVar85._4_4_;
  fVar164 = auVar80._8_4_;
  auVar150._8_4_ = fVar164 * auVar85._8_4_;
  fVar166 = auVar80._12_4_;
  auVar150._12_4_ = fVar166 * auVar85._12_4_;
  fVar168 = auVar80._16_4_;
  auVar150._16_4_ = fVar168 * auVar85._16_4_;
  fVar136 = auVar80._20_4_;
  auVar150._20_4_ = fVar136 * auVar85._20_4_;
  fVar170 = auVar80._24_4_;
  auVar150._28_36_ = in_ZMM4._28_36_;
  auVar150._24_4_ = fVar170 * auVar85._24_4_;
  auVar81._4_4_ = auVar83._4_4_ * fVar151;
  auVar81._0_4_ = auVar83._0_4_ * fVar135;
  auVar81._8_4_ = auVar83._8_4_ * fVar164;
  auVar81._12_4_ = auVar83._12_4_ * fVar166;
  auVar81._16_4_ = auVar83._16_4_ * fVar168;
  auVar81._20_4_ = auVar83._20_4_ * fVar136;
  auVar81._24_4_ = auVar83._24_4_ * fVar170;
  auVar81._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = fVar151 * auVar90._4_4_;
  auVar91._0_4_ = fVar135 * auVar90._0_4_;
  auVar91._8_4_ = fVar164 * auVar90._8_4_;
  auVar91._12_4_ = fVar166 * auVar90._12_4_;
  auVar91._16_4_ = fVar168 * auVar90._16_4_;
  auVar91._20_4_ = fVar136 * auVar90._20_4_;
  auVar91._24_4_ = fVar170 * auVar90._24_4_;
  auVar91._28_4_ = auVar80._28_4_;
  auVar68 = vfmadd231ps_fma(auVar150._0_32_,auVar92,auVar82);
  auVar11 = vfmadd231ps_fma(auVar81,auVar92,auVar87);
  auVar69 = vfmadd231ps_fma(auVar91,auVar89,auVar92);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar100,auVar84);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar100,auVar86);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar88,auVar100);
  auVar101._4_4_ = fVar199;
  auVar101._0_4_ = fVar199;
  auVar101._8_4_ = fVar199;
  auVar101._12_4_ = fVar199;
  auVar101._16_4_ = fVar199;
  auVar101._20_4_ = fVar199;
  auVar101._24_4_ = fVar199;
  auVar101._28_4_ = fVar199;
  auVar92 = ZEXT1632(CONCAT412(fVar248 * auVar76._12_4_,
                               CONCAT48(fVar248 * auVar76._8_4_,
                                        CONCAT44(fVar248 * auVar76._4_4_,fVar199))));
  auVar91 = vpermps_avx2(auVar102,auVar92);
  auVar81 = vpermps_avx512vl(auVar79,auVar92);
  fVar248 = auVar81._0_4_;
  fVar135 = auVar81._4_4_;
  auVar92._4_4_ = fVar135 * auVar85._4_4_;
  auVar92._0_4_ = fVar248 * auVar85._0_4_;
  fVar151 = auVar81._8_4_;
  auVar92._8_4_ = fVar151 * auVar85._8_4_;
  fVar164 = auVar81._12_4_;
  auVar92._12_4_ = fVar164 * auVar85._12_4_;
  fVar166 = auVar81._16_4_;
  auVar92._16_4_ = fVar166 * auVar85._16_4_;
  fVar168 = auVar81._20_4_;
  auVar92._20_4_ = fVar168 * auVar85._20_4_;
  fVar136 = auVar81._24_4_;
  auVar92._24_4_ = fVar136 * auVar85._24_4_;
  auVar92._28_4_ = auVar85._28_4_;
  auVar95._0_4_ = fVar248 * auVar83._0_4_;
  auVar95._4_4_ = fVar135 * auVar83._4_4_;
  auVar95._8_4_ = fVar151 * auVar83._8_4_;
  auVar95._12_4_ = fVar164 * auVar83._12_4_;
  auVar95._16_4_ = fVar166 * auVar83._16_4_;
  auVar95._20_4_ = fVar168 * auVar83._20_4_;
  auVar95._24_4_ = fVar136 * auVar83._24_4_;
  auVar95._28_4_ = 0;
  auVar83._4_4_ = fVar135 * auVar90._4_4_;
  auVar83._0_4_ = fVar248 * auVar90._0_4_;
  auVar83._8_4_ = fVar151 * auVar90._8_4_;
  auVar83._12_4_ = fVar164 * auVar90._12_4_;
  auVar83._16_4_ = fVar166 * auVar90._16_4_;
  auVar83._20_4_ = fVar168 * auVar90._20_4_;
  auVar83._24_4_ = fVar136 * auVar90._24_4_;
  auVar83._28_4_ = auVar90._28_4_;
  auVar70 = vfmadd231ps_fma(auVar92,auVar91,auVar82);
  auVar66 = vfmadd231ps_fma(auVar95,auVar91,auVar87);
  auVar74 = vfmadd231ps_fma(auVar83,auVar91,auVar89);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar101,auVar84);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar101,auVar86);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar101,auVar88);
  auVar97._8_4_ = 0x7fffffff;
  auVar97._0_8_ = 0x7fffffff7fffffff;
  auVar97._12_4_ = 0x7fffffff;
  auVar97._16_4_ = 0x7fffffff;
  auVar97._20_4_ = 0x7fffffff;
  auVar97._24_4_ = 0x7fffffff;
  auVar97._28_4_ = 0x7fffffff;
  auVar99._8_4_ = 0x219392ef;
  auVar99._0_8_ = 0x219392ef219392ef;
  auVar99._12_4_ = 0x219392ef;
  auVar99._16_4_ = 0x219392ef;
  auVar99._20_4_ = 0x219392ef;
  auVar99._24_4_ = 0x219392ef;
  auVar99._28_4_ = 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar68),auVar97);
  uVar61 = vcmpps_avx512vl(auVar84,auVar99,1);
  bVar62 = (bool)((byte)uVar61 & 1);
  auVar79._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._0_4_;
  bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._4_4_;
  bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._8_4_;
  bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar68._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar11),auVar97);
  uVar61 = vcmpps_avx512vl(auVar84,auVar99,1);
  bVar62 = (bool)((byte)uVar61 & 1);
  auVar80._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar11._0_4_;
  bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar11._4_4_;
  bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar11._8_4_;
  bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar11._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar84 = vandps_avx(ZEXT1632(auVar69),auVar97);
  uVar61 = vcmpps_avx512vl(auVar84,auVar99,1);
  bVar62 = (bool)((byte)uVar61 & 1);
  auVar84._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._0_4_;
  bVar62 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._4_4_;
  bVar62 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._8_4_;
  bVar62 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar69._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar82 = vrcp14ps_avx512vl(auVar79);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar98._16_4_ = 0x3f800000;
  auVar98._20_4_ = 0x3f800000;
  auVar98._24_4_ = 0x3f800000;
  auVar98._28_4_ = 0x3f800000;
  auVar68 = vfnmadd213ps_fma(auVar79,auVar82,auVar98);
  auVar68 = vfmadd132ps_fma(ZEXT1632(auVar68),auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar80);
  auVar11 = vfnmadd213ps_fma(auVar80,auVar82,auVar98);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar84);
  auVar69 = vfnmadd213ps_fma(auVar84,auVar82,auVar98);
  auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar82,auVar82);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 7 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar70));
  auVar88._4_4_ = auVar68._4_4_ * auVar84._4_4_;
  auVar88._0_4_ = auVar68._0_4_ * auVar84._0_4_;
  auVar88._8_4_ = auVar68._8_4_ * auVar84._8_4_;
  auVar88._12_4_ = auVar68._12_4_ * auVar84._12_4_;
  auVar88._16_4_ = auVar84._16_4_ * 0.0;
  auVar88._20_4_ = auVar84._20_4_ * 0.0;
  auVar88._24_4_ = auVar84._24_4_ * 0.0;
  auVar88._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 9 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar70));
  auVar96._0_4_ = auVar68._0_4_ * auVar84._0_4_;
  auVar96._4_4_ = auVar68._4_4_ * auVar84._4_4_;
  auVar96._8_4_ = auVar68._8_4_ * auVar84._8_4_;
  auVar96._12_4_ = auVar68._12_4_ * auVar84._12_4_;
  auVar96._16_4_ = auVar84._16_4_ * 0.0;
  auVar96._20_4_ = auVar84._20_4_ * 0.0;
  auVar96._24_4_ = auVar84._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 0xe + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar66));
  auVar89._4_4_ = auVar11._4_4_ * auVar84._4_4_;
  auVar89._0_4_ = auVar11._0_4_ * auVar84._0_4_;
  auVar89._8_4_ = auVar11._8_4_ * auVar84._8_4_;
  auVar89._12_4_ = auVar11._12_4_ * auVar84._12_4_;
  auVar89._16_4_ = auVar84._16_4_ * 0.0;
  auVar89._20_4_ = auVar84._20_4_ * 0.0;
  auVar89._24_4_ = auVar84._24_4_ * 0.0;
  auVar89._28_4_ = auVar84._28_4_;
  auVar83 = vpbroadcastd_avx512vl();
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar66));
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 0x15 + 6));
  auVar94._0_4_ = auVar11._0_4_ * auVar84._0_4_;
  auVar94._4_4_ = auVar11._4_4_ * auVar84._4_4_;
  auVar94._8_4_ = auVar11._8_4_ * auVar84._8_4_;
  auVar94._12_4_ = auVar11._12_4_ * auVar84._12_4_;
  auVar94._16_4_ = auVar84._16_4_ * 0.0;
  auVar94._20_4_ = auVar84._20_4_ * 0.0;
  auVar94._24_4_ = auVar84._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar84 = vcvtdq2ps_avx(auVar82);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar74));
  auVar90._4_4_ = auVar84._4_4_ * auVar69._4_4_;
  auVar90._0_4_ = auVar84._0_4_ * auVar69._0_4_;
  auVar90._8_4_ = auVar84._8_4_ * auVar69._8_4_;
  auVar90._12_4_ = auVar84._12_4_ * auVar69._12_4_;
  auVar90._16_4_ = auVar84._16_4_ * 0.0;
  auVar90._20_4_ = auVar84._20_4_ * 0.0;
  auVar90._24_4_ = auVar84._24_4_ * 0.0;
  auVar90._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 0x17 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar74));
  auVar93._0_4_ = auVar69._0_4_ * auVar84._0_4_;
  auVar93._4_4_ = auVar69._4_4_ * auVar84._4_4_;
  auVar93._8_4_ = auVar69._8_4_ * auVar84._8_4_;
  auVar93._12_4_ = auVar69._12_4_ * auVar84._12_4_;
  auVar93._16_4_ = auVar84._16_4_ * 0.0;
  auVar93._20_4_ = auVar84._20_4_ * 0.0;
  auVar93._24_4_ = auVar84._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar84 = vpminsd_avx2(auVar88,auVar96);
  auVar82 = vpminsd_avx2(auVar89,auVar94);
  auVar84 = vmaxps_avx(auVar84,auVar82);
  auVar82 = vpminsd_avx2(auVar90,auVar93);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar85._4_4_ = uVar153;
  auVar85._0_4_ = uVar153;
  auVar85._8_4_ = uVar153;
  auVar85._12_4_ = uVar153;
  auVar85._16_4_ = uVar153;
  auVar85._20_4_ = uVar153;
  auVar85._24_4_ = uVar153;
  auVar85._28_4_ = uVar153;
  auVar82 = vmaxps_avx512vl(auVar82,auVar85);
  auVar84 = vmaxps_avx(auVar84,auVar82);
  auVar82._8_4_ = 0x3f7ffffa;
  auVar82._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar82._12_4_ = 0x3f7ffffa;
  auVar82._16_4_ = 0x3f7ffffa;
  auVar82._20_4_ = 0x3f7ffffa;
  auVar82._24_4_ = 0x3f7ffffa;
  auVar82._28_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar84,auVar82);
  auVar84 = vpmaxsd_avx2(auVar88,auVar96);
  auVar82 = vpmaxsd_avx2(auVar89,auVar94);
  auVar84 = vminps_avx(auVar84,auVar82);
  auVar82 = vpmaxsd_avx2(auVar90,auVar93);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar86._4_4_ = uVar153;
  auVar86._0_4_ = uVar153;
  auVar86._8_4_ = uVar153;
  auVar86._12_4_ = uVar153;
  auVar86._16_4_ = uVar153;
  auVar86._20_4_ = uVar153;
  auVar86._24_4_ = uVar153;
  auVar86._28_4_ = uVar153;
  auVar82 = vminps_avx512vl(auVar82,auVar86);
  auVar84 = vminps_avx(auVar84,auVar82);
  auVar87._8_4_ = 0x3f800003;
  auVar87._0_8_ = 0x3f8000033f800003;
  auVar87._12_4_ = 0x3f800003;
  auVar87._16_4_ = 0x3f800003;
  auVar87._20_4_ = 0x3f800003;
  auVar87._24_4_ = 0x3f800003;
  auVar87._28_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar87);
  uVar12 = vcmpps_avx512vl(local_5a0,auVar84,2);
  uVar14 = vpcmpgtd_avx512vl(auVar83,_DAT_01fb4ba0);
  uVar61 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar14));
  auVar150 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar150);
LAB_01a81441:
  if (uVar61 == 0) {
LAB_01a83db5:
    return uVar61 != 0;
  }
  lVar16 = 0;
  for (uVar55 = uVar61; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar16 = lVar16 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar16 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar16 = *(long *)&pGVar2[1].time_range.upper;
  auVar68 = *(undefined1 (*) [16])(lVar16 + (long)p_Var3 * uVar55);
  auVar11 = *(undefined1 (*) [16])(lVar16 + (uVar55 + 1) * (long)p_Var3);
  auVar69 = *(undefined1 (*) [16])(lVar16 + (uVar55 + 2) * (long)p_Var3);
  local_8c8 = uVar61 - 1 & uVar61;
  auVar70 = *(undefined1 (*) [16])(lVar16 + (uVar55 + 3) * (long)p_Var3);
  if (local_8c8 != 0) {
    uVar58 = local_8c8 - 1 & local_8c8;
    for (uVar55 = local_8c8; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    }
    if (uVar58 != 0) {
      for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar74 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_720 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar66 = vunpcklps_avx512vl(local_700._0_16_,local_720._0_16_);
  _local_740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar72 = local_740._0_16_;
  local_990 = vinsertps_avx512f(auVar66,auVar72,0x28);
  auVar76._0_4_ = auVar68._0_4_ + auVar11._0_4_ + auVar69._0_4_ + auVar70._0_4_;
  auVar76._4_4_ = auVar68._4_4_ + auVar11._4_4_ + auVar69._4_4_ + auVar70._4_4_;
  auVar76._8_4_ = auVar68._8_4_ + auVar11._8_4_ + auVar69._8_4_ + auVar70._8_4_;
  auVar76._12_4_ = auVar68._12_4_ + auVar11._12_4_ + auVar69._12_4_ + auVar70._12_4_;
  auVar75._8_4_ = 0x3e800000;
  auVar75._0_8_ = 0x3e8000003e800000;
  auVar75._12_4_ = 0x3e800000;
  auVar66 = vmulps_avx512vl(auVar76,auVar75);
  auVar66 = vsubps_avx(auVar66,auVar74);
  auVar66 = vdpps_avx(auVar66,local_990,0x7f);
  fVar248 = *(float *)(ray + k * 4 + 0xc0);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar73._4_12_ = ZEXT812(0) << 0x20;
  auVar73._0_4_ = local_9a0._0_4_;
  auVar67 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar73);
  auVar71 = vfnmadd213ss_fma(auVar67,local_9a0,ZEXT416(0x40000000));
  local_580 = auVar66._0_4_ * auVar67._0_4_ * auVar71._0_4_;
  auVar228._4_4_ = local_580;
  auVar228._0_4_ = local_580;
  auVar228._8_4_ = local_580;
  auVar228._12_4_ = local_580;
  fStack_970 = local_580;
  _local_980 = auVar228;
  fStack_96c = local_580;
  fStack_968 = local_580;
  fStack_964 = local_580;
  auVar66 = vfmadd231ps_fma(auVar74,local_990,auVar228);
  auVar66 = vblendps_avx(auVar66,ZEXT816(0) << 0x40,8);
  auVar68 = vsubps_avx(auVar68,auVar66);
  auVar69 = vsubps_avx(auVar69,auVar66);
  auVar11 = vsubps_avx(auVar11,auVar66);
  auVar70 = vsubps_avx(auVar70,auVar66);
  local_9e0 = vbroadcastss_avx512vl(auVar68);
  auVar250 = ZEXT3264(local_9e0);
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  local_860 = ZEXT1632(auVar68);
  local_a00 = vpermps_avx2(auVar104,local_860);
  auVar245 = ZEXT3264(local_a00);
  auVar105._8_4_ = 2;
  auVar105._0_8_ = 0x200000002;
  auVar105._12_4_ = 2;
  auVar105._16_4_ = 2;
  auVar105._20_4_ = 2;
  auVar105._24_4_ = 2;
  auVar105._28_4_ = 2;
  local_a20 = vpermps_avx2(auVar105,local_860);
  auVar247 = ZEXT3264(local_a20);
  auVar106._8_4_ = 3;
  auVar106._0_8_ = 0x300000003;
  auVar106._12_4_ = 3;
  auVar106._16_4_ = 3;
  auVar106._20_4_ = 3;
  auVar106._24_4_ = 3;
  auVar106._28_4_ = 3;
  local_a40 = vpermps_avx2(auVar106,local_860);
  uVar153 = auVar11._0_4_;
  local_a60._4_4_ = uVar153;
  local_a60._0_4_ = uVar153;
  local_a60._8_4_ = uVar153;
  local_a60._12_4_ = uVar153;
  local_a60._16_4_ = uVar153;
  local_a60._20_4_ = uVar153;
  local_a60._24_4_ = uVar153;
  local_a60._28_4_ = uVar153;
  auVar233 = ZEXT3264(local_a60);
  local_8a0 = ZEXT1632(auVar11);
  local_a80 = vpermps_avx2(auVar104,local_8a0);
  local_aa0 = vpermps_avx2(auVar105,local_8a0);
  auVar249 = ZEXT3264(local_aa0);
  auVar84 = vpermps_avx512vl(auVar106,local_8a0);
  auVar239 = ZEXT3264(local_aa0);
  auVar82 = vbroadcastss_avx512vl(auVar69);
  local_880 = ZEXT1632(auVar69);
  auVar85 = vpermps_avx512vl(auVar104,local_880);
  auVar86 = vpermps_avx512vl(auVar105,local_880);
  auVar87 = vpermps_avx512vl(auVar106,local_880);
  auVar237 = ZEXT3264(local_a80);
  fVar135 = auVar70._0_4_;
  _local_8c0 = ZEXT1632(auVar70);
  auVar83 = vpermps_avx512vl(auVar104,_local_8c0);
  auVar88 = vpermps_avx512vl(auVar105,_local_8c0);
  auVar89 = vpermps_avx512vl(auVar106,_local_8c0);
  auVar68 = vmulss_avx512f(auVar72,auVar72);
  auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar68),local_720,local_720);
  auVar90 = vfmadd231ps_avx512vl(auVar90,local_700,local_700);
  auVar90 = vbroadcastss_avx512vl(auVar90._0_16_);
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar90,auVar103);
  local_560 = auVar90;
  local_930 = ZEXT416((uint)local_580);
  local_580 = fVar248 - local_580;
  auVar241 = ZEXT3264(local_a40);
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  auVar150 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar150);
  uVar55 = 0;
  bVar54 = 0;
  local_cdc = 1;
  auVar150 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar150);
  auVar68 = vsqrtss_avx(local_9a0,local_9a0);
  auVar11 = vsqrtss_avx(local_9a0,local_9a0);
  local_630 = ZEXT816(0x3f80000000000000);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar252 = ZEXT3264(auVar91);
  auVar150 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar69 = vmovshdup_avx(local_630);
    auVar69 = vsubps_avx(auVar69,local_630);
    fVar170 = auVar69._0_4_;
    fVar136 = fVar170 * 0.04761905;
    auVar195._0_4_ = local_630._0_4_;
    auVar195._4_4_ = auVar195._0_4_;
    auVar195._8_4_ = auVar195._0_4_;
    auVar195._12_4_ = auVar195._0_4_;
    auVar195._16_4_ = auVar195._0_4_;
    auVar195._20_4_ = auVar195._0_4_;
    auVar195._24_4_ = auVar195._0_4_;
    auVar195._28_4_ = auVar195._0_4_;
    auVar77._4_4_ = fVar170;
    auVar77._0_4_ = fVar170;
    auVar77._8_4_ = fVar170;
    auVar77._12_4_ = fVar170;
    auVar212._16_4_ = fVar170;
    auVar212._0_16_ = auVar77;
    auVar212._20_4_ = fVar170;
    auVar212._24_4_ = fVar170;
    auVar212._28_4_ = fVar170;
    auVar69 = vfmadd231ps_fma(auVar195,auVar212,auVar150._0_32_);
    auVar251 = auVar252._0_32_;
    auVar91 = vsubps_avx512vl(auVar251,ZEXT1632(auVar69));
    fVar151 = auVar69._0_4_;
    fVar164 = auVar69._4_4_;
    auVar218._4_4_ = auVar233._4_4_ * fVar164;
    auVar218._0_4_ = auVar233._0_4_ * fVar151;
    fVar166 = auVar69._8_4_;
    auVar218._8_4_ = auVar233._8_4_ * fVar166;
    fVar168 = auVar69._12_4_;
    auVar218._12_4_ = auVar233._12_4_ * fVar168;
    auVar218._16_4_ = auVar233._16_4_ * 0.0;
    auVar218._20_4_ = auVar233._20_4_ * 0.0;
    auVar218._24_4_ = auVar233._24_4_ * 0.0;
    auVar218._28_4_ = auVar195._0_4_;
    auVar112._4_4_ = auVar237._4_4_ * fVar164;
    auVar112._0_4_ = auVar237._0_4_ * fVar151;
    auVar112._8_4_ = auVar237._8_4_ * fVar166;
    auVar112._12_4_ = auVar237._12_4_ * fVar168;
    auVar112._16_4_ = auVar237._16_4_ * 0.0;
    auVar112._20_4_ = auVar237._20_4_ * 0.0;
    auVar112._24_4_ = auVar237._24_4_ * 0.0;
    auVar112._28_4_ = fVar170;
    auVar220._0_4_ = auVar239._0_4_ * fVar151;
    auVar220._4_4_ = auVar239._4_4_ * fVar164;
    auVar220._8_4_ = auVar239._8_4_ * fVar166;
    auVar220._12_4_ = auVar239._12_4_ * fVar168;
    auVar220._16_4_ = auVar239._16_4_ * 0.0;
    auVar220._20_4_ = auVar239._20_4_ * 0.0;
    auVar220._28_36_ = auVar150._28_36_;
    auVar220._24_4_ = auVar239._24_4_ * 0.0;
    auVar92 = vmulps_avx512vl(auVar84,ZEXT1632(auVar69));
    auVar81 = vfmadd231ps_avx512vl(auVar218,auVar91,auVar250._0_32_);
    auVar70 = vfmadd231ps_fma(auVar112,auVar91,auVar245._0_32_);
    auVar66 = vfmadd231ps_fma(auVar220._0_32_,auVar91,auVar247._0_32_);
    auVar74 = vfmadd231ps_fma(auVar92,auVar91,auVar241._0_32_);
    auVar92 = vmulps_avx512vl(auVar82,ZEXT1632(auVar69));
    auVar95 = ZEXT1632(auVar69);
    auVar79 = vmulps_avx512vl(auVar85,auVar95);
    auVar80 = vmulps_avx512vl(auVar86,auVar95);
    auVar93 = vmulps_avx512vl(auVar87,auVar95);
    auVar71 = vfmadd231ps_fma(auVar92,auVar91,auVar233._0_32_);
    auVar67 = vfmadd231ps_fma(auVar79,auVar91,auVar237._0_32_);
    auVar72 = vfmadd231ps_fma(auVar80,auVar91,auVar239._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar84);
    auVar113._4_4_ = fVar135 * fVar164;
    auVar113._0_4_ = fVar135 * fVar151;
    auVar113._8_4_ = fVar135 * fVar166;
    auVar113._12_4_ = fVar135 * fVar168;
    auVar113._16_4_ = fVar135 * 0.0;
    auVar113._20_4_ = fVar135 * 0.0;
    auVar113._24_4_ = fVar135 * 0.0;
    auVar113._28_4_ = auVar233._28_4_;
    auVar79 = vmulps_avx512vl(auVar83,auVar95);
    auVar80 = vmulps_avx512vl(auVar88,auVar95);
    auVar93 = vmulps_avx512vl(auVar89,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar113,auVar91,auVar82);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar91,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar86);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar87);
    auVar233._28_36_ = auVar249._28_36_;
    auVar233._0_28_ =
         ZEXT1628(CONCAT412(fVar168 * auVar71._12_4_,
                            CONCAT48(fVar166 * auVar71._8_4_,
                                     CONCAT44(fVar164 * auVar71._4_4_,fVar151 * auVar71._0_4_))));
    auVar95 = vmulps_avx512vl(auVar95,ZEXT1632(auVar67));
    auVar96 = vmulps_avx512vl(ZEXT1632(auVar69),ZEXT1632(auVar72));
    auVar97 = vmulps_avx512vl(ZEXT1632(auVar69),auVar92);
    auVar69 = vfmadd231ps_fma(auVar233._0_32_,auVar91,auVar81);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,ZEXT1632(auVar70));
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar66));
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,ZEXT1632(auVar74));
    auVar231._0_4_ = auVar94._0_4_ * fVar151;
    auVar231._4_4_ = auVar94._4_4_ * fVar164;
    auVar231._8_4_ = auVar94._8_4_ * fVar166;
    auVar231._12_4_ = auVar94._12_4_ * fVar168;
    auVar231._16_4_ = auVar94._16_4_ * 0.0;
    auVar231._20_4_ = auVar94._20_4_ * 0.0;
    auVar231._24_4_ = auVar94._24_4_ * 0.0;
    auVar231._28_4_ = 0;
    auVar114._4_4_ = auVar79._4_4_ * fVar164;
    auVar114._0_4_ = auVar79._0_4_ * fVar151;
    auVar114._8_4_ = auVar79._8_4_ * fVar166;
    auVar114._12_4_ = auVar79._12_4_ * fVar168;
    auVar114._16_4_ = auVar79._16_4_ * 0.0;
    auVar114._20_4_ = auVar79._20_4_ * 0.0;
    auVar114._24_4_ = auVar79._24_4_ * 0.0;
    auVar114._28_4_ = auVar94._28_4_;
    auVar117._4_4_ = auVar80._4_4_ * fVar164;
    auVar117._0_4_ = auVar80._0_4_ * fVar151;
    auVar117._8_4_ = auVar80._8_4_ * fVar166;
    auVar117._12_4_ = auVar80._12_4_ * fVar168;
    auVar117._16_4_ = auVar80._16_4_ * 0.0;
    auVar117._20_4_ = auVar80._20_4_ * 0.0;
    auVar117._24_4_ = auVar80._24_4_ * 0.0;
    auVar117._28_4_ = auVar79._28_4_;
    auVar118._4_4_ = auVar93._4_4_ * fVar164;
    auVar118._0_4_ = auVar93._0_4_ * fVar151;
    auVar118._8_4_ = auVar93._8_4_ * fVar166;
    auVar118._12_4_ = auVar93._12_4_ * fVar168;
    auVar118._16_4_ = auVar93._16_4_ * 0.0;
    auVar118._20_4_ = auVar93._20_4_ * 0.0;
    auVar118._24_4_ = auVar93._24_4_ * 0.0;
    auVar118._28_4_ = auVar80._28_4_;
    auVar70 = vfmadd231ps_fma(auVar231,auVar91,ZEXT1632(auVar71));
    auVar66 = vfmadd231ps_fma(auVar114,auVar91,ZEXT1632(auVar67));
    auVar74 = vfmadd231ps_fma(auVar117,auVar91,ZEXT1632(auVar72));
    auVar71 = vfmadd231ps_fma(auVar118,auVar91,auVar92);
    auVar34._28_4_ = auVar81._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(auVar74._12_4_ * fVar168,
                            CONCAT48(auVar74._8_4_ * fVar166,
                                     CONCAT44(auVar74._4_4_ * fVar164,auVar74._0_4_ * fVar151))));
    auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar168 * auVar70._12_4_,
                                                 CONCAT48(fVar166 * auVar70._8_4_,
                                                          CONCAT44(fVar164 * auVar70._4_4_,
                                                                   fVar151 * auVar70._0_4_)))),
                              auVar91,ZEXT1632(auVar69));
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar66._12_4_ * fVar168,
                                            CONCAT48(auVar66._8_4_ * fVar166,
                                                     CONCAT44(auVar66._4_4_ * fVar164,
                                                              auVar66._0_4_ * fVar151)))),auVar91,
                         auVar95);
    auVar98 = vfmadd231ps_avx512vl(auVar34,auVar91,auVar96);
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar71._12_4_ * fVar168,
                                            CONCAT48(auVar71._8_4_ * fVar166,
                                                     CONCAT44(auVar71._4_4_ * fVar164,
                                                              auVar71._0_4_ * fVar151)))),auVar97,
                         auVar91);
    auVar91 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar69));
    auVar81 = vsubps_avx512vl(ZEXT1632(auVar66),auVar95);
    auVar79 = vsubps_avx512vl(ZEXT1632(auVar74),auVar96);
    auVar80 = vsubps_avx512vl(ZEXT1632(auVar71),auVar97);
    auVar242._0_4_ = fVar136 * auVar91._0_4_ * 3.0;
    auVar242._4_4_ = fVar136 * auVar91._4_4_ * 3.0;
    auVar242._8_4_ = fVar136 * auVar91._8_4_ * 3.0;
    auVar242._12_4_ = fVar136 * auVar91._12_4_ * 3.0;
    auVar242._16_4_ = fVar136 * auVar91._16_4_ * 3.0;
    auVar242._20_4_ = fVar136 * auVar91._20_4_ * 3.0;
    auVar242._24_4_ = fVar136 * auVar91._24_4_ * 3.0;
    auVar242._28_4_ = 0;
    auVar246._0_4_ = fVar136 * auVar81._0_4_ * 3.0;
    auVar246._4_4_ = fVar136 * auVar81._4_4_ * 3.0;
    auVar246._8_4_ = fVar136 * auVar81._8_4_ * 3.0;
    auVar246._12_4_ = fVar136 * auVar81._12_4_ * 3.0;
    auVar246._16_4_ = fVar136 * auVar81._16_4_ * 3.0;
    auVar246._20_4_ = fVar136 * auVar81._20_4_ * 3.0;
    auVar246._24_4_ = fVar136 * auVar81._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    auVar35._4_4_ = fVar136 * auVar79._4_4_ * 3.0;
    auVar35._0_4_ = fVar136 * auVar79._0_4_ * 3.0;
    auVar35._8_4_ = fVar136 * auVar79._8_4_ * 3.0;
    auVar35._12_4_ = fVar136 * auVar79._12_4_ * 3.0;
    auVar35._16_4_ = fVar136 * auVar79._16_4_ * 3.0;
    auVar35._20_4_ = fVar136 * auVar79._20_4_ * 3.0;
    auVar35._24_4_ = fVar136 * auVar79._24_4_ * 3.0;
    auVar35._28_4_ = auVar93._28_4_;
    fVar151 = auVar80._0_4_ * 3.0 * fVar136;
    fVar164 = auVar80._4_4_ * 3.0 * fVar136;
    auVar36._4_4_ = fVar164;
    auVar36._0_4_ = fVar151;
    fVar166 = auVar80._8_4_ * 3.0 * fVar136;
    auVar36._8_4_ = fVar166;
    fVar168 = auVar80._12_4_ * 3.0 * fVar136;
    auVar36._12_4_ = fVar168;
    fVar170 = auVar80._16_4_ * 3.0 * fVar136;
    auVar36._16_4_ = fVar170;
    fVar199 = auVar80._20_4_ * 3.0 * fVar136;
    auVar36._20_4_ = fVar199;
    fVar173 = auVar80._24_4_ * 3.0 * fVar136;
    auVar36._24_4_ = fVar173;
    auVar36._28_4_ = fVar136;
    auVar69 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar69);
    auVar93 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar95 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar81 = ZEXT1632(auVar69);
    auVar96 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar81);
    auVar225._0_4_ = auVar92._0_4_ + fVar151;
    auVar225._4_4_ = auVar92._4_4_ + fVar164;
    auVar225._8_4_ = auVar92._8_4_ + fVar166;
    auVar225._12_4_ = auVar92._12_4_ + fVar168;
    auVar225._16_4_ = auVar92._16_4_ + fVar170;
    auVar225._20_4_ = auVar92._20_4_ + fVar199;
    auVar225._24_4_ = auVar92._24_4_ + fVar173;
    auVar225._28_4_ = auVar92._28_4_ + fVar136;
    auVar91 = vmaxps_avx(auVar92,auVar225);
    auVar97 = vminps_avx512vl(auVar92,auVar225);
    auVar99 = vpermt2ps_avx512vl(auVar92,_DAT_01fb9fc0,auVar81);
    auVar100 = vpermt2ps_avx512vl(auVar242,_DAT_01fb9fc0,auVar81);
    auVar101 = vpermt2ps_avx512vl(auVar246,_DAT_01fb9fc0,auVar81);
    auVar112 = ZEXT1632(auVar69);
    auVar102 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9fc0,auVar112);
    auVar92 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9fc0,auVar112);
    auVar92 = vsubps_avx(auVar99,auVar92);
    auVar81 = vsubps_avx(auVar93,ZEXT1632(auVar67));
    auVar79 = vsubps_avx(auVar95,auVar94);
    auVar80 = vsubps_avx(auVar96,auVar98);
    auVar103 = vmulps_avx512vl(auVar79,auVar35);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar246,auVar80);
    auVar104 = vmulps_avx512vl(auVar80,auVar242);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar35,auVar81);
    auVar105 = vmulps_avx512vl(auVar81,auVar246);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar242,auVar79);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar104 = vmulps_avx512vl(auVar80,auVar80);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar79,auVar79);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar81,auVar81);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar106 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar251);
    auVar105 = vfmadd132ps_avx512vl(auVar106,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar105);
    auVar106 = vmulps_avx512vl(auVar79,auVar102);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar101,auVar80);
    auVar107 = vmulps_avx512vl(auVar80,auVar100);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar102,auVar81);
    auVar108 = vmulps_avx512vl(auVar81,auVar101);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar100,auVar79);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar103 = vmaxps_avx512vl(auVar103,auVar105);
    auVar103 = vsqrtps_avx512vl(auVar103);
    auVar105 = vmaxps_avx512vl(auVar92,auVar99);
    auVar91 = vmaxps_avx512vl(auVar91,auVar105);
    auVar105 = vaddps_avx512vl(auVar103,auVar91);
    auVar91 = vminps_avx(auVar92,auVar99);
    auVar91 = vminps_avx512vl(auVar97,auVar91);
    auVar91 = vsubps_avx512vl(auVar91,auVar103);
    auVar107._8_4_ = 0x3f800002;
    auVar107._0_8_ = 0x3f8000023f800002;
    auVar107._12_4_ = 0x3f800002;
    auVar107._16_4_ = 0x3f800002;
    auVar107._20_4_ = 0x3f800002;
    auVar107._24_4_ = 0x3f800002;
    auVar107._28_4_ = 0x3f800002;
    auVar92 = vmulps_avx512vl(auVar105,auVar107);
    auVar108._8_4_ = 0x3f7ffffc;
    auVar108._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar108._12_4_ = 0x3f7ffffc;
    auVar108._16_4_ = 0x3f7ffffc;
    auVar108._20_4_ = 0x3f7ffffc;
    auVar108._24_4_ = 0x3f7ffffc;
    auVar108._28_4_ = 0x3f7ffffc;
    auVar91 = vmulps_avx512vl(auVar91,auVar108);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar97 = vrsqrt14ps_avx512vl(auVar104);
    auVar109._8_4_ = 0xbf000000;
    auVar109._0_8_ = 0xbf000000bf000000;
    auVar109._12_4_ = 0xbf000000;
    auVar109._16_4_ = 0xbf000000;
    auVar109._20_4_ = 0xbf000000;
    auVar109._24_4_ = 0xbf000000;
    auVar109._28_4_ = 0xbf000000;
    auVar99 = vmulps_avx512vl(auVar104,auVar109);
    fVar151 = auVar97._0_4_;
    fVar164 = auVar97._4_4_;
    fVar166 = auVar97._8_4_;
    fVar168 = auVar97._12_4_;
    fVar136 = auVar97._16_4_;
    fVar170 = auVar97._20_4_;
    fVar199 = auVar97._24_4_;
    auVar37._4_4_ = fVar164 * fVar164 * fVar164 * auVar99._4_4_;
    auVar37._0_4_ = fVar151 * fVar151 * fVar151 * auVar99._0_4_;
    auVar37._8_4_ = fVar166 * fVar166 * fVar166 * auVar99._8_4_;
    auVar37._12_4_ = fVar168 * fVar168 * fVar168 * auVar99._12_4_;
    auVar37._16_4_ = fVar136 * fVar136 * fVar136 * auVar99._16_4_;
    auVar37._20_4_ = fVar170 * fVar170 * fVar170 * auVar99._20_4_;
    auVar37._24_4_ = fVar199 * fVar199 * fVar199 * auVar99._24_4_;
    auVar37._28_4_ = auVar105._28_4_;
    auVar110._8_4_ = 0x3fc00000;
    auVar110._0_8_ = 0x3fc000003fc00000;
    auVar110._12_4_ = 0x3fc00000;
    auVar110._16_4_ = 0x3fc00000;
    auVar110._20_4_ = 0x3fc00000;
    auVar110._24_4_ = 0x3fc00000;
    auVar110._28_4_ = 0x3fc00000;
    auVar97 = vfmadd231ps_avx512vl(auVar37,auVar97,auVar110);
    auVar249 = ZEXT3264(auVar97);
    auVar99 = vmulps_avx512vl(auVar81,auVar97);
    auVar103 = vmulps_avx512vl(auVar79,auVar97);
    auVar104 = vmulps_avx512vl(auVar80,auVar97);
    auVar218 = ZEXT1632(auVar67);
    auVar105 = vsubps_avx512vl(auVar112,auVar218);
    auVar106 = vsubps_avx512vl(auVar112,auVar94);
    auVar107 = vsubps_avx512vl(auVar112,auVar98);
    auVar108 = vmulps_avx512vl(_local_740,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_720,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,local_700,auVar105);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar105);
    auVar110 = vmulps_avx512vl(_local_740,auVar104);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar103,local_720);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar99,local_700);
    auVar104 = vmulps_avx512vl(auVar107,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar103);
    auVar99 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar99);
    auVar103 = vmulps_avx512vl(auVar110,auVar110);
    auVar104 = vsubps_avx512vl(auVar90,auVar103);
    auVar111 = vmulps_avx512vl(auVar110,auVar99);
    auVar108 = vsubps_avx512vl(auVar108,auVar111);
    auVar108 = vaddps_avx512vl(auVar108,auVar108);
    auVar111 = vmulps_avx512vl(auVar99,auVar99);
    auVar109 = vsubps_avx512vl(auVar109,auVar111);
    auVar92 = vsubps_avx512vl(auVar109,auVar92);
    local_7a0 = vmulps_avx512vl(auVar108,auVar108);
    auVar111._8_4_ = 0x40800000;
    auVar111._0_8_ = 0x4080000040800000;
    auVar111._12_4_ = 0x40800000;
    auVar111._16_4_ = 0x40800000;
    auVar111._20_4_ = 0x40800000;
    auVar111._24_4_ = 0x40800000;
    auVar111._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar104,auVar111);
    auVar111 = vmulps_avx512vl(_local_7c0,auVar92);
    auVar111 = vsubps_avx512vl(local_7a0,auVar111);
    uVar58 = vcmpps_avx512vl(auVar111,auVar112,5);
    bVar51 = (byte)uVar58;
    fVar151 = (float)local_980._0_4_;
    fVar164 = (float)local_980._4_4_;
    fVar166 = fStack_978;
    fVar168 = fStack_974;
    fVar136 = fStack_970;
    fVar170 = fStack_96c;
    fVar199 = fStack_968;
    fVar173 = fStack_964;
    if (bVar51 == 0) {
LAB_01a821af:
      auVar150 = ZEXT3264(_DAT_01f7b040);
      auVar250 = ZEXT3264(local_9e0);
      auVar245 = ZEXT3264(local_a00);
      auVar247 = ZEXT3264(local_a20);
      auVar241 = ZEXT3264(local_a40);
      auVar233 = ZEXT3264(local_a60);
      auVar237 = ZEXT3264(local_a80);
      auVar239 = ZEXT3264(local_aa0);
    }
    else {
      local_780._0_32_ = auVar109;
      auVar111 = vsqrtps_avx512vl(auVar111);
      auVar112 = vaddps_avx512vl(auVar104,auVar104);
      local_840 = vrcp14ps_avx512vl(auVar112);
      in_ZMM31 = ZEXT3264(local_840);
      auVar113 = vfnmadd213ps_avx512vl(local_840,auVar112,auVar251);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_840,local_840);
      auVar251._8_4_ = 0x80000000;
      auVar251._0_8_ = 0x8000000080000000;
      auVar251._12_4_ = 0x80000000;
      auVar251._16_4_ = 0x80000000;
      auVar251._20_4_ = 0x80000000;
      auVar251._24_4_ = 0x80000000;
      auVar251._28_4_ = 0x80000000;
      local_7e0 = vxorps_avx512vl(auVar108,auVar251);
      auVar114 = vsubps_avx512vl(local_7e0,auVar111);
      local_960 = vmulps_avx512vl(auVar114,auVar113);
      auVar111 = vsubps_avx512vl(auVar111,auVar108);
      local_9c0 = vmulps_avx512vl(auVar111,auVar113);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar111,local_960);
      auVar115._0_4_ =
           (uint)(bVar51 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar111._0_4_;
      bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar62 * auVar113._4_4_ | (uint)!bVar62 * auVar111._4_4_;
      bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar62 * auVar113._8_4_ | (uint)!bVar62 * auVar111._8_4_;
      bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar62 * auVar113._12_4_ | (uint)!bVar62 * auVar111._12_4_;
      bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar62 * auVar113._16_4_ | (uint)!bVar62 * auVar111._16_4_;
      bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar62 * auVar113._20_4_ | (uint)!bVar62 * auVar111._20_4_;
      bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar62 * auVar113._24_4_ | (uint)!bVar62 * auVar111._24_4_;
      bVar62 = SUB81(uVar58 >> 7,0);
      auVar115._28_4_ = (uint)bVar62 * auVar113._28_4_ | (uint)!bVar62 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar111,local_9c0);
      auVar116._0_4_ =
           (uint)(bVar51 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar111._0_4_;
      bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar62 * auVar113._4_4_ | (uint)!bVar62 * auVar111._4_4_;
      bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar62 * auVar113._8_4_ | (uint)!bVar62 * auVar111._8_4_;
      bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar62 * auVar113._12_4_ | (uint)!bVar62 * auVar111._12_4_;
      bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar62 * auVar113._16_4_ | (uint)!bVar62 * auVar111._16_4_;
      bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar62 * auVar113._20_4_ | (uint)!bVar62 * auVar111._20_4_;
      bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar62 * auVar113._24_4_ | (uint)!bVar62 * auVar111._24_4_;
      bVar62 = SUB81(uVar58 >> 7,0);
      auVar116._28_4_ = (uint)bVar62 * auVar113._28_4_ | (uint)!bVar62 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar111);
      local_800 = vmaxps_avx512vl(local_560,auVar111);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar27);
      vandps_avx512vl(auVar104,auVar111);
      uVar60 = vcmpps_avx512vl(local_820,local_820,1);
      uVar58 = uVar58 & uVar60;
      bVar57 = (byte)uVar58;
      if (bVar57 != 0) {
        uVar60 = vcmpps_avx512vl(auVar92,_DAT_01f7b000,2);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar104 = vblendmps_avx512vl(auVar92,auVar103);
        bVar56 = (byte)uVar60;
        uVar65 = (uint)(bVar56 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar56 & 1) * local_820._0_4_;
        bVar62 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar128 = (uint)bVar62 * auVar104._4_4_ | (uint)!bVar62 * local_820._4_4_;
        bVar62 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar129 = (uint)bVar62 * auVar104._8_4_ | (uint)!bVar62 * local_820._8_4_;
        bVar62 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar130 = (uint)bVar62 * auVar104._12_4_ | (uint)!bVar62 * local_820._12_4_;
        bVar62 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar131 = (uint)bVar62 * auVar104._16_4_ | (uint)!bVar62 * local_820._16_4_;
        bVar62 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar132 = (uint)bVar62 * auVar104._20_4_ | (uint)!bVar62 * local_820._20_4_;
        bVar62 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar133 = (uint)bVar62 * auVar104._24_4_ | (uint)!bVar62 * local_820._24_4_;
        bVar62 = SUB81(uVar60 >> 7,0);
        uVar134 = (uint)bVar62 * auVar104._28_4_ | (uint)!bVar62 * local_820._28_4_;
        auVar115._0_4_ = (bVar57 & 1) * uVar65 | !(bool)(bVar57 & 1) * auVar115._0_4_;
        bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar115._4_4_ = bVar62 * uVar128 | !bVar62 * auVar115._4_4_;
        bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar115._8_4_ = bVar62 * uVar129 | !bVar62 * auVar115._8_4_;
        bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar115._12_4_ = bVar62 * uVar130 | !bVar62 * auVar115._12_4_;
        bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar115._16_4_ = bVar62 * uVar131 | !bVar62 * auVar115._16_4_;
        bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar115._20_4_ = bVar62 * uVar132 | !bVar62 * auVar115._20_4_;
        bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar115._24_4_ = bVar62 * uVar133 | !bVar62 * auVar115._24_4_;
        bVar62 = SUB81(uVar58 >> 7,0);
        auVar115._28_4_ = bVar62 * uVar134 | !bVar62 * auVar115._28_4_;
        auVar92 = vblendmps_avx512vl(auVar103,auVar92);
        bVar62 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar10 = SUB81(uVar60 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar57 & 1) *
             ((uint)(bVar56 & 1) * auVar92._0_4_ | !(bool)(bVar56 & 1) * uVar65) |
             !(bool)(bVar57 & 1) * auVar116._0_4_;
        bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar4 * ((uint)bVar62 * auVar92._4_4_ | !bVar62 * uVar128) |
             !bVar4 * auVar116._4_4_;
        bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar62 * ((uint)bVar5 * auVar92._8_4_ | !bVar5 * uVar129) |
             !bVar62 * auVar116._8_4_;
        bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar62 * ((uint)bVar6 * auVar92._12_4_ | !bVar6 * uVar130) |
             !bVar62 * auVar116._12_4_;
        bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar62 * ((uint)bVar7 * auVar92._16_4_ | !bVar7 * uVar131) |
             !bVar62 * auVar116._16_4_;
        bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar62 * ((uint)bVar8 * auVar92._20_4_ | !bVar8 * uVar132) |
             !bVar62 * auVar116._20_4_;
        bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar62 * ((uint)bVar9 * auVar92._24_4_ | !bVar9 * uVar133) |
             !bVar62 * auVar116._24_4_;
        bVar62 = SUB81(uVar58 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar62 * ((uint)bVar10 * auVar92._28_4_ | !bVar10 * uVar134) |
             !bVar62 * auVar116._28_4_;
        bVar51 = (~bVar57 | bVar56) & bVar51;
      }
      if ((bVar51 & 0x7f) == 0) {
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar252 = ZEXT3264(auVar91);
        auVar150 = ZEXT3264(_DAT_01f7b040);
        auVar250 = ZEXT3264(local_9e0);
        auVar245 = ZEXT3264(local_a00);
        auVar247 = ZEXT3264(local_a20);
        auVar241 = ZEXT3264(local_a40);
        auVar233 = ZEXT3264(local_a60);
        auVar237 = ZEXT3264(local_a80);
        auVar239 = ZEXT3264(local_aa0);
      }
      else {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar102 = vxorps_avx512vl(auVar102,auVar92);
        auVar100 = vxorps_avx512vl(auVar100,auVar92);
        auVar150 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar101 = vxorps_avx512vl(auVar101,auVar92);
        auVar69 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                 ZEXT416((uint)local_930._0_4_));
        auVar103 = vbroadcastss_avx512vl(auVar69);
        auVar103 = vminps_avx512vl(auVar103,auVar116);
        auVar50._4_4_ = fStack_57c;
        auVar50._0_4_ = local_580;
        auVar50._8_4_ = fStack_578;
        auVar50._12_4_ = fStack_574;
        auVar50._16_4_ = fStack_570;
        auVar50._20_4_ = fStack_56c;
        auVar50._24_4_ = fStack_568;
        auVar50._28_4_ = fStack_564;
        auVar104 = vmaxps_avx512vl(auVar50,auVar115);
        auVar107 = vmulps_avx512vl(auVar107,auVar35);
        auVar106 = vfmadd213ps_avx512vl(auVar106,auVar246,auVar107);
        auVar69 = vfmadd213ps_fma(auVar105,auVar242,auVar106);
        in_ZMM31 = ZEXT3264(_local_740);
        auVar105 = vmulps_avx512vl(_local_740,auVar35);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_720,auVar246);
        auVar105 = vfmadd231ps_avx512vl(auVar105,local_700,auVar242);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar105,auVar106);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar12 = vcmpps_avx512vl(auVar106,auVar107,1);
        auVar111 = vxorps_avx512vl(ZEXT1632(auVar69),auVar92);
        auVar113 = vrcp14ps_avx512vl(auVar105);
        auVar114 = vxorps_avx512vl(auVar105,auVar92);
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar118 = vfnmadd213ps_avx512vl(auVar113,auVar105,auVar117);
        auVar69 = vfmadd132ps_fma(auVar118,auVar113,auVar113);
        fVar152 = auVar69._0_4_ * auVar111._0_4_;
        fVar165 = auVar69._4_4_ * auVar111._4_4_;
        auVar38._4_4_ = fVar165;
        auVar38._0_4_ = fVar152;
        fVar167 = auVar69._8_4_ * auVar111._8_4_;
        auVar38._8_4_ = fVar167;
        fVar169 = auVar69._12_4_ * auVar111._12_4_;
        auVar38._12_4_ = fVar169;
        fVar171 = auVar111._16_4_ * 0.0;
        auVar38._16_4_ = fVar171;
        fVar172 = auVar111._20_4_ * 0.0;
        auVar38._20_4_ = fVar172;
        fVar174 = auVar111._24_4_ * 0.0;
        auVar38._24_4_ = fVar174;
        auVar38._28_4_ = auVar111._28_4_;
        uVar14 = vcmpps_avx512vl(auVar105,auVar114,1);
        bVar57 = (byte)uVar12 | (byte)uVar14;
        auVar243._8_4_ = 0xff800000;
        auVar243._0_8_ = 0xff800000ff800000;
        auVar243._12_4_ = 0xff800000;
        auVar243._16_4_ = 0xff800000;
        auVar243._20_4_ = 0xff800000;
        auVar243._24_4_ = 0xff800000;
        auVar243._28_4_ = 0xff800000;
        auVar113 = vblendmps_avx512vl(auVar38,auVar243);
        auVar119._0_4_ = (uint)(bVar57 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar57 & 1) * -0x800000
        ;
        bVar62 = (bool)(bVar57 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar62 * auVar113._4_4_ | (uint)!bVar62 * -0x800000;
        bVar62 = (bool)(bVar57 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar62 * auVar113._8_4_ | (uint)!bVar62 * -0x800000;
        bVar62 = (bool)(bVar57 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar62 * auVar113._12_4_ | (uint)!bVar62 * -0x800000;
        bVar62 = (bool)(bVar57 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar62 * auVar113._16_4_ | (uint)!bVar62 * -0x800000;
        bVar62 = (bool)(bVar57 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar62 * auVar113._20_4_ | (uint)!bVar62 * -0x800000;
        bVar62 = (bool)(bVar57 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar62 * auVar113._24_4_ | (uint)!bVar62 * -0x800000;
        auVar119._28_4_ =
             (uint)(bVar57 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar57 >> 7) * -0x800000;
        auVar113 = vmaxps_avx512vl(auVar104,auVar119);
        uVar14 = vcmpps_avx512vl(auVar105,auVar114,6);
        bVar57 = (byte)uVar12 | (byte)uVar14;
        auVar120._0_4_ = (uint)(bVar57 & 1) * 0x7f800000 | (uint)!(bool)(bVar57 & 1) * (int)fVar152;
        bVar62 = (bool)(bVar57 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar165;
        bVar62 = (bool)(bVar57 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar167;
        bVar62 = (bool)(bVar57 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar169;
        bVar62 = (bool)(bVar57 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar171;
        bVar62 = (bool)(bVar57 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar172;
        bVar62 = (bool)(bVar57 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar174;
        auVar120._28_4_ =
             (uint)(bVar57 >> 7) * 0x7f800000 | (uint)!(bool)(bVar57 >> 7) * auVar111._28_4_;
        auVar103 = vminps_avx512vl(auVar103,auVar120);
        auVar69 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
        auVar93 = vsubps_avx512vl(ZEXT1632(auVar69),auVar93);
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar69),auVar95);
        auVar104 = ZEXT1632(auVar69);
        auVar96 = vsubps_avx512vl(auVar104,auVar96);
        auVar96 = vmulps_avx512vl(auVar96,auVar102);
        auVar95 = vfmadd231ps_avx512vl(auVar96,auVar101,auVar95);
        auVar93 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar93);
        auVar95 = vmulps_avx512vl(_local_740,auVar102);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_720,auVar101);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_700,auVar100);
        vandps_avx512vl(auVar95,auVar106);
        uVar12 = vcmpps_avx512vl(auVar95,auVar107,1);
        auVar93 = vxorps_avx512vl(auVar93,auVar92);
        auVar96 = vrcp14ps_avx512vl(auVar95);
        auVar92 = vxorps_avx512vl(auVar95,auVar92);
        auVar100 = vfnmadd213ps_avx512vl(auVar96,auVar95,auVar117);
        auVar69 = vfmadd132ps_fma(auVar100,auVar96,auVar96);
        fVar152 = auVar69._0_4_ * auVar93._0_4_;
        fVar165 = auVar69._4_4_ * auVar93._4_4_;
        auVar39._4_4_ = fVar165;
        auVar39._0_4_ = fVar152;
        fVar167 = auVar69._8_4_ * auVar93._8_4_;
        auVar39._8_4_ = fVar167;
        fVar169 = auVar69._12_4_ * auVar93._12_4_;
        auVar39._12_4_ = fVar169;
        fVar171 = auVar93._16_4_ * 0.0;
        auVar39._16_4_ = fVar171;
        fVar172 = auVar93._20_4_ * 0.0;
        auVar39._20_4_ = fVar172;
        fVar174 = auVar93._24_4_ * 0.0;
        auVar39._24_4_ = fVar174;
        auVar39._28_4_ = auVar93._28_4_;
        uVar14 = vcmpps_avx512vl(auVar95,auVar92,1);
        bVar57 = (byte)uVar12 | (byte)uVar14;
        auVar28._8_4_ = 0xff800000;
        auVar28._0_8_ = 0xff800000ff800000;
        auVar28._12_4_ = 0xff800000;
        auVar28._16_4_ = 0xff800000;
        auVar28._20_4_ = 0xff800000;
        auVar28._24_4_ = 0xff800000;
        auVar28._28_4_ = 0xff800000;
        auVar100 = vblendmps_avx512vl(auVar39,auVar28);
        auVar121._0_4_ =
             (uint)(bVar57 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar96._0_4_;
        bVar62 = (bool)(bVar57 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar62 * auVar100._4_4_ | (uint)!bVar62 * auVar96._4_4_;
        bVar62 = (bool)(bVar57 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar62 * auVar100._8_4_ | (uint)!bVar62 * auVar96._8_4_;
        bVar62 = (bool)(bVar57 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar62 * auVar100._12_4_ | (uint)!bVar62 * auVar96._12_4_;
        bVar62 = (bool)(bVar57 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar62 * auVar100._16_4_ | (uint)!bVar62 * auVar96._16_4_;
        bVar62 = (bool)(bVar57 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar62 * auVar100._20_4_ | (uint)!bVar62 * auVar96._20_4_;
        bVar62 = (bool)(bVar57 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar62 * auVar100._24_4_ | (uint)!bVar62 * auVar96._24_4_;
        auVar121._28_4_ =
             (uint)(bVar57 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar96._28_4_;
        local_6e0 = vmaxps_avx(auVar113,auVar121);
        uVar14 = vcmpps_avx512vl(auVar95,auVar92,6);
        bVar57 = (byte)uVar12 | (byte)uVar14;
        auVar122._0_4_ = (uint)(bVar57 & 1) * 0x7f800000 | (uint)!(bool)(bVar57 & 1) * (int)fVar152;
        bVar62 = (bool)(bVar57 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar165;
        bVar62 = (bool)(bVar57 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar167;
        bVar62 = (bool)(bVar57 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar169;
        bVar62 = (bool)(bVar57 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar171;
        bVar62 = (bool)(bVar57 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar172;
        bVar62 = (bool)(bVar57 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar62 * 0x7f800000 | (uint)!bVar62 * (int)fVar174;
        auVar122._28_4_ =
             (uint)(bVar57 >> 7) * 0x7f800000 | (uint)!(bool)(bVar57 >> 7) * auVar93._28_4_;
        local_5e0 = vminps_avx(auVar103,auVar122);
        uVar12 = vcmpps_avx512vl(local_6e0,local_5e0,2);
        bVar51 = bVar51 & 0x7f & (byte)uVar12;
        if (bVar51 == 0) {
          auVar252 = ZEXT3264(auVar117);
          goto LAB_01a821af;
        }
        auVar92 = vmaxps_avx512vl(auVar104,auVar91);
        auVar91 = vfmadd213ps_avx512vl(local_960,auVar110,auVar99);
        fVar152 = auVar97._0_4_;
        fVar165 = auVar97._4_4_;
        auVar40._4_4_ = fVar165 * auVar91._4_4_;
        auVar40._0_4_ = fVar152 * auVar91._0_4_;
        fVar167 = auVar97._8_4_;
        auVar40._8_4_ = fVar167 * auVar91._8_4_;
        fVar169 = auVar97._12_4_;
        auVar40._12_4_ = fVar169 * auVar91._12_4_;
        fVar171 = auVar97._16_4_;
        auVar40._16_4_ = fVar171 * auVar91._16_4_;
        fVar172 = auVar97._20_4_;
        auVar40._20_4_ = fVar172 * auVar91._20_4_;
        fVar174 = auVar97._24_4_;
        auVar40._24_4_ = fVar174 * auVar91._24_4_;
        auVar40._28_4_ = auVar91._28_4_;
        auVar91 = vfmadd213ps_avx512vl(local_9c0,auVar110,auVar99);
        auVar41._4_4_ = fVar165 * auVar91._4_4_;
        auVar41._0_4_ = fVar152 * auVar91._0_4_;
        auVar41._8_4_ = fVar167 * auVar91._8_4_;
        auVar41._12_4_ = fVar169 * auVar91._12_4_;
        auVar41._16_4_ = fVar171 * auVar91._16_4_;
        auVar41._20_4_ = fVar172 * auVar91._20_4_;
        auVar41._24_4_ = fVar174 * auVar91._24_4_;
        auVar41._28_4_ = auVar91._28_4_;
        auVar91 = vminps_avx512vl(auVar40,auVar117);
        auVar93 = ZEXT832(0) << 0x20;
        auVar91 = vmaxps_avx(auVar91,ZEXT832(0) << 0x20);
        auVar95 = vminps_avx512vl(auVar41,auVar117);
        auVar42._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar91._28_4_ + 7.0;
        local_520 = vfmadd213ps_avx512vl(auVar42,auVar212,auVar195);
        auVar91 = vmaxps_avx(auVar95,ZEXT832(0) << 0x20);
        auVar43._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar91._28_4_ + 7.0;
        local_540 = vfmadd213ps_avx512vl(auVar43,auVar212,auVar195);
        auVar44._4_4_ = auVar92._4_4_ * auVar92._4_4_;
        auVar44._0_4_ = auVar92._0_4_ * auVar92._0_4_;
        auVar44._8_4_ = auVar92._8_4_ * auVar92._8_4_;
        auVar44._12_4_ = auVar92._12_4_ * auVar92._12_4_;
        auVar44._16_4_ = auVar92._16_4_ * auVar92._16_4_;
        auVar44._20_4_ = auVar92._20_4_ * auVar92._20_4_;
        auVar44._24_4_ = auVar92._24_4_ * auVar92._24_4_;
        auVar44._28_4_ = auVar92._28_4_;
        auVar91 = vsubps_avx(auVar109,auVar44);
        auVar45._4_4_ = auVar91._4_4_ * (float)local_7c0._4_4_;
        auVar45._0_4_ = auVar91._0_4_ * (float)local_7c0._0_4_;
        auVar45._8_4_ = auVar91._8_4_ * fStack_7b8;
        auVar45._12_4_ = auVar91._12_4_ * fStack_7b4;
        auVar45._16_4_ = auVar91._16_4_ * fStack_7b0;
        auVar45._20_4_ = auVar91._20_4_ * fStack_7ac;
        auVar45._24_4_ = auVar91._24_4_ * fStack_7a8;
        auVar45._28_4_ = auVar92._28_4_;
        auVar92 = vsubps_avx(local_7a0,auVar45);
        uVar12 = vcmpps_avx512vl(auVar92,ZEXT832(0) << 0x20,5);
        bVar57 = (byte)uVar12;
        if (bVar57 == 0) {
          bVar57 = 0;
          auVar81 = ZEXT832(0) << 0x20;
          auVar233 = ZEXT864(0) << 0x20;
          auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar240 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar123._8_4_ = 0x7f800000;
          auVar123._0_8_ = 0x7f8000007f800000;
          auVar123._12_4_ = 0x7f800000;
          auVar123._16_4_ = 0x7f800000;
          auVar123._20_4_ = 0x7f800000;
          auVar123._24_4_ = 0x7f800000;
          auVar123._28_4_ = 0x7f800000;
          auVar124._8_4_ = 0xff800000;
          auVar124._0_8_ = 0xff800000ff800000;
          auVar124._12_4_ = 0xff800000;
          auVar124._16_4_ = 0xff800000;
          auVar124._20_4_ = 0xff800000;
          auVar124._24_4_ = 0xff800000;
          auVar124._28_4_ = 0xff800000;
        }
        else {
          auVar70 = vxorps_avx512vl(auVar77,auVar77);
          uVar58 = vcmpps_avx512vl(auVar92,auVar104,5);
          auVar92 = vsqrtps_avx(auVar92);
          auVar93 = vfnmadd213ps_avx512vl(auVar112,local_840,auVar117);
          auVar96 = vfmadd132ps_avx512vl(auVar93,local_840,local_840);
          auVar93 = vsubps_avx(local_7e0,auVar92);
          auVar100 = vmulps_avx512vl(auVar93,auVar96);
          auVar92 = vsubps_avx512vl(auVar92,auVar108);
          auVar96 = vmulps_avx512vl(auVar92,auVar96);
          auVar92 = vfmadd213ps_avx512vl(auVar110,auVar100,auVar99);
          auVar46._4_4_ = fVar165 * auVar92._4_4_;
          auVar46._0_4_ = fVar152 * auVar92._0_4_;
          auVar46._8_4_ = fVar167 * auVar92._8_4_;
          auVar46._12_4_ = fVar169 * auVar92._12_4_;
          auVar46._16_4_ = fVar171 * auVar92._16_4_;
          auVar46._20_4_ = fVar172 * auVar92._20_4_;
          auVar46._24_4_ = fVar174 * auVar92._24_4_;
          auVar46._28_4_ = auVar95._28_4_;
          auVar92 = vmulps_avx512vl(local_700,auVar100);
          auVar93 = vmulps_avx512vl(local_720,auVar100);
          auVar101 = vmulps_avx512vl(_local_740,auVar100);
          auVar95 = vfmadd213ps_avx512vl(auVar81,auVar46,auVar218);
          auVar92 = vsubps_avx512vl(auVar92,auVar95);
          auVar95 = vfmadd213ps_avx512vl(auVar79,auVar46,auVar94);
          auVar95 = vsubps_avx512vl(auVar93,auVar95);
          auVar69 = vfmadd213ps_fma(auVar46,auVar80,auVar98);
          auVar93 = vsubps_avx(auVar101,ZEXT1632(auVar69));
          auVar240 = auVar93._0_28_;
          auVar93 = vfmadd213ps_avx512vl(auVar110,auVar96,auVar99);
          auVar97 = vmulps_avx512vl(auVar97,auVar93);
          auVar249 = ZEXT3264(auVar97);
          auVar93 = vmulps_avx512vl(local_700,auVar96);
          auVar99 = vmulps_avx512vl(local_720,auVar96);
          auVar101 = vmulps_avx512vl(_local_740,auVar96);
          auVar69 = vfmadd213ps_fma(auVar81,auVar97,auVar218);
          auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar79,auVar97,auVar94);
          auVar81 = vsubps_avx512vl(auVar99,ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar80,auVar97,auVar98);
          auVar79 = vsubps_avx512vl(auVar101,ZEXT1632(auVar69));
          auVar233 = ZEXT3264(auVar79);
          auVar196._8_4_ = 0x7f800000;
          auVar196._0_8_ = 0x7f8000007f800000;
          auVar196._12_4_ = 0x7f800000;
          auVar196._16_4_ = 0x7f800000;
          auVar196._20_4_ = 0x7f800000;
          auVar196._24_4_ = 0x7f800000;
          auVar196._28_4_ = 0x7f800000;
          auVar79 = vblendmps_avx512vl(auVar196,auVar100);
          bVar62 = (bool)((byte)uVar58 & 1);
          auVar123._0_4_ = (uint)bVar62 * auVar79._0_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar62 * auVar79._4_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar62 * auVar79._8_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar62 * auVar79._12_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar123._16_4_ = (uint)bVar62 * auVar79._16_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar123._20_4_ = (uint)bVar62 * auVar79._20_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar123._24_4_ = (uint)bVar62 * auVar79._24_4_ | (uint)!bVar62 * 0x7f800000;
          bVar62 = SUB81(uVar58 >> 7,0);
          auVar123._28_4_ = (uint)bVar62 * auVar79._28_4_ | (uint)!bVar62 * 0x7f800000;
          auVar219._8_4_ = 0xff800000;
          auVar219._0_8_ = 0xff800000ff800000;
          auVar219._12_4_ = 0xff800000;
          auVar219._16_4_ = 0xff800000;
          auVar219._20_4_ = 0xff800000;
          auVar219._24_4_ = 0xff800000;
          auVar219._28_4_ = 0xff800000;
          auVar79 = vblendmps_avx512vl(auVar219,auVar96);
          bVar62 = (bool)((byte)uVar58 & 1);
          auVar124._0_4_ = (uint)bVar62 * auVar79._0_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar62 * auVar79._4_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar62 * auVar79._8_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar62 * auVar79._12_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar62 * auVar79._16_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar62 * auVar79._20_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar62 * auVar79._24_4_ | (uint)!bVar62 * -0x800000;
          bVar62 = SUB81(uVar58 >> 7,0);
          auVar124._28_4_ = (uint)bVar62 * auVar79._28_4_ | (uint)!bVar62 * -0x800000;
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar79 = vmulps_avx512vl(local_800,auVar29);
          uVar60 = vcmpps_avx512vl(auVar79,local_820,0xe);
          uVar58 = uVar58 & uVar60;
          bVar56 = (byte)uVar58;
          if (bVar56 != 0) {
            uVar60 = vcmpps_avx512vl(auVar91,ZEXT1632(auVar70),2);
            auVar238._8_4_ = 0x7f800000;
            auVar238._0_8_ = 0x7f8000007f800000;
            auVar238._12_4_ = 0x7f800000;
            auVar238._16_4_ = 0x7f800000;
            auVar238._20_4_ = 0x7f800000;
            auVar238._24_4_ = 0x7f800000;
            auVar238._28_4_ = 0x7f800000;
            auVar244._8_4_ = 0xff800000;
            auVar244._0_8_ = 0xff800000ff800000;
            auVar244._12_4_ = 0xff800000;
            auVar244._16_4_ = 0xff800000;
            auVar244._20_4_ = 0xff800000;
            auVar244._24_4_ = 0xff800000;
            auVar244._28_4_ = 0xff800000;
            auVar91 = vblendmps_avx512vl(auVar238,auVar244);
            bVar52 = (byte)uVar60;
            uVar65 = (uint)(bVar52 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar79._0_4_;
            bVar62 = (bool)((byte)(uVar60 >> 1) & 1);
            uVar128 = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * auVar79._4_4_;
            bVar62 = (bool)((byte)(uVar60 >> 2) & 1);
            uVar129 = (uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * auVar79._8_4_;
            bVar62 = (bool)((byte)(uVar60 >> 3) & 1);
            uVar130 = (uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * auVar79._12_4_;
            bVar62 = (bool)((byte)(uVar60 >> 4) & 1);
            uVar131 = (uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * auVar79._16_4_;
            bVar62 = (bool)((byte)(uVar60 >> 5) & 1);
            uVar132 = (uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * auVar79._20_4_;
            bVar62 = (bool)((byte)(uVar60 >> 6) & 1);
            uVar133 = (uint)bVar62 * auVar91._24_4_ | (uint)!bVar62 * auVar79._24_4_;
            bVar62 = SUB81(uVar60 >> 7,0);
            uVar134 = (uint)bVar62 * auVar91._28_4_ | (uint)!bVar62 * auVar79._28_4_;
            auVar123._0_4_ = (bVar56 & 1) * uVar65 | !(bool)(bVar56 & 1) * auVar123._0_4_;
            bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
            auVar123._4_4_ = bVar62 * uVar128 | !bVar62 * auVar123._4_4_;
            bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
            auVar123._8_4_ = bVar62 * uVar129 | !bVar62 * auVar123._8_4_;
            bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
            auVar123._12_4_ = bVar62 * uVar130 | !bVar62 * auVar123._12_4_;
            bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
            auVar123._16_4_ = bVar62 * uVar131 | !bVar62 * auVar123._16_4_;
            bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
            auVar123._20_4_ = bVar62 * uVar132 | !bVar62 * auVar123._20_4_;
            bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
            auVar123._24_4_ = bVar62 * uVar133 | !bVar62 * auVar123._24_4_;
            bVar62 = SUB81(uVar58 >> 7,0);
            auVar123._28_4_ = bVar62 * uVar134 | !bVar62 * auVar123._28_4_;
            auVar91 = vblendmps_avx512vl(auVar244,auVar238);
            bVar62 = (bool)((byte)(uVar60 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar60 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar60 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar60 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar60 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar60 >> 6) & 1);
            bVar10 = SUB81(uVar60 >> 7,0);
            auVar124._0_4_ =
                 (uint)(bVar56 & 1) *
                 ((uint)(bVar52 & 1) * auVar91._0_4_ | !(bool)(bVar52 & 1) * uVar65) |
                 !(bool)(bVar56 & 1) * auVar124._0_4_;
            bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
            auVar124._4_4_ =
                 (uint)bVar4 * ((uint)bVar62 * auVar91._4_4_ | !bVar62 * uVar128) |
                 !bVar4 * auVar124._4_4_;
            bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
            auVar124._8_4_ =
                 (uint)bVar62 * ((uint)bVar5 * auVar91._8_4_ | !bVar5 * uVar129) |
                 !bVar62 * auVar124._8_4_;
            bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
            auVar124._12_4_ =
                 (uint)bVar62 * ((uint)bVar6 * auVar91._12_4_ | !bVar6 * uVar130) |
                 !bVar62 * auVar124._12_4_;
            bVar62 = (bool)((byte)(uVar58 >> 4) & 1);
            auVar124._16_4_ =
                 (uint)bVar62 * ((uint)bVar7 * auVar91._16_4_ | !bVar7 * uVar131) |
                 !bVar62 * auVar124._16_4_;
            bVar62 = (bool)((byte)(uVar58 >> 5) & 1);
            auVar124._20_4_ =
                 (uint)bVar62 * ((uint)bVar8 * auVar91._20_4_ | !bVar8 * uVar132) |
                 !bVar62 * auVar124._20_4_;
            bVar62 = (bool)((byte)(uVar58 >> 6) & 1);
            auVar124._24_4_ =
                 (uint)bVar62 * ((uint)bVar9 * auVar91._24_4_ | !bVar9 * uVar133) |
                 !bVar62 * auVar124._24_4_;
            bVar62 = SUB81(uVar58 >> 7,0);
            auVar124._28_4_ =
                 (uint)bVar62 * ((uint)bVar10 * auVar91._28_4_ | !bVar10 * uVar134) |
                 !bVar62 * auVar124._28_4_;
            bVar57 = (~bVar56 | bVar52) & bVar57;
          }
        }
        auVar237._0_4_ = (float)local_740._0_4_ * auVar233._0_4_;
        auVar237._4_4_ = (float)local_740._4_4_ * auVar233._4_4_;
        auVar237._8_4_ = fStack_738 * auVar233._8_4_;
        auVar237._12_4_ = fStack_734 * auVar233._12_4_;
        auVar237._16_4_ = fStack_730 * auVar233._16_4_;
        auVar237._20_4_ = fStack_72c * auVar233._20_4_;
        auVar237._28_36_ = auVar233._28_36_;
        auVar237._24_4_ = fStack_728 * auVar233._24_4_;
        auVar69 = vfmadd231ps_fma(auVar237._0_32_,local_720,auVar81);
        auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_700,auVar93);
        auVar236._8_4_ = 0x7fffffff;
        auVar236._0_8_ = 0x7fffffff7fffffff;
        auVar236._12_4_ = 0x7fffffff;
        auVar236._16_4_ = 0x7fffffff;
        auVar236._20_4_ = 0x7fffffff;
        auVar236._24_4_ = 0x7fffffff;
        auVar236._28_4_ = 0x7fffffff;
        auVar91 = vandps_avx(ZEXT1632(auVar69),auVar236);
        _local_440 = local_6e0;
        auVar232._8_4_ = 0x3e99999a;
        auVar232._0_8_ = 0x3e99999a3e99999a;
        auVar232._12_4_ = 0x3e99999a;
        auVar232._16_4_ = 0x3e99999a;
        auVar232._20_4_ = 0x3e99999a;
        auVar232._24_4_ = 0x3e99999a;
        auVar232._28_4_ = 0x3e99999a;
        uVar12 = vcmpps_avx512vl(auVar91,auVar232,1);
        _local_680 = vmaxps_avx(local_6e0,auVar124);
        auVar91 = vminps_avx(local_5e0,auVar123);
        uVar14 = vcmpps_avx512vl(local_6e0,auVar91,2);
        bVar56 = (byte)uVar14 & bVar51;
        uVar13 = vcmpps_avx512vl(_local_680,local_5e0,2);
        if ((bVar51 & ((byte)uVar13 | (byte)uVar14)) == 0) {
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar252 = ZEXT3264(auVar91);
          auVar150 = ZEXT3264(_DAT_01f7b040);
          auVar250 = ZEXT3264(local_9e0);
          auVar245 = ZEXT3264(local_a00);
          auVar247 = ZEXT3264(local_a20);
          auVar241 = ZEXT3264(local_a40);
          auVar233 = ZEXT3264(local_a60);
          auVar237 = ZEXT3264(local_a80);
          auVar239 = ZEXT3264(local_aa0);
        }
        else {
          bVar52 = (byte)uVar12 | ~bVar57;
          auVar47._4_4_ = (float)local_740._4_4_ * auVar240._4_4_;
          auVar47._0_4_ = (float)local_740._0_4_ * auVar240._0_4_;
          auVar47._8_4_ = fStack_738 * auVar240._8_4_;
          auVar47._12_4_ = fStack_734 * auVar240._12_4_;
          auVar47._16_4_ = fStack_730 * auVar240._16_4_;
          auVar47._20_4_ = fStack_72c * auVar240._20_4_;
          auVar47._24_4_ = fStack_728 * auVar240._24_4_;
          auVar47._28_4_ = auVar91._28_4_;
          auVar69 = vfmadd213ps_fma(auVar95,local_720,auVar47);
          auVar69 = vfmadd213ps_fma(auVar92,local_700,ZEXT1632(auVar69));
          auVar91 = vandps_avx(ZEXT1632(auVar69),auVar236);
          uVar12 = vcmpps_avx512vl(auVar91,auVar232,1);
          bVar57 = (byte)uVar12 | ~bVar57;
          auVar144._8_4_ = 2;
          auVar144._0_8_ = 0x200000002;
          auVar144._12_4_ = 2;
          auVar144._16_4_ = 2;
          auVar144._20_4_ = 2;
          auVar144._24_4_ = 2;
          auVar144._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar144,auVar30);
          local_5c0._0_4_ = (uint)(bVar57 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
          bVar62 = (bool)(bVar57 >> 1 & 1);
          local_5c0._4_4_ = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar57 >> 2 & 1);
          local_5c0._8_4_ = (uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar57 >> 3 & 1);
          local_5c0._12_4_ = (uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar57 >> 4 & 1);
          local_5c0._16_4_ = (uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar57 >> 5 & 1);
          local_5c0._20_4_ = (uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar57 >> 6 & 1);
          local_5c0._24_4_ = (uint)bVar62 * auVar91._24_4_ | (uint)!bVar62 * 2;
          local_5c0._28_4_ = (uint)(bVar57 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2;
          local_620 = vpbroadcastd_avx512vl();
          uVar12 = vpcmpd_avx512vl(local_620,local_5c0,5);
          local_660 = local_6e0._0_4_ + (float)local_980._0_4_;
          fStack_65c = local_6e0._4_4_ + (float)local_980._4_4_;
          fStack_658 = local_6e0._8_4_ + fStack_978;
          fStack_654 = local_6e0._12_4_ + fStack_974;
          fStack_650 = local_6e0._16_4_ + fStack_970;
          fStack_64c = local_6e0._20_4_ + fStack_96c;
          fStack_648 = local_6e0._24_4_ + fStack_968;
          fStack_644 = local_6e0._28_4_ + fStack_964;
          _local_600 = _local_680;
          for (bVar57 = (byte)uVar12 & bVar56; bVar57 != 0; bVar57 = ~bVar59 & bVar57 & (byte)uVar12
              ) {
            auVar145._8_4_ = 0x7f800000;
            auVar145._0_8_ = 0x7f8000007f800000;
            auVar145._12_4_ = 0x7f800000;
            auVar145._16_4_ = 0x7f800000;
            auVar145._20_4_ = 0x7f800000;
            auVar145._24_4_ = 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar145,local_6e0);
            auVar125._0_4_ =
                 (uint)(bVar57 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 1 & 1);
            auVar125._4_4_ = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 2 & 1);
            auVar125._8_4_ = (uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 3 & 1);
            auVar125._12_4_ = (uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 4 & 1);
            auVar125._16_4_ = (uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 5 & 1);
            auVar125._20_4_ = (uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * 0x7f800000;
            auVar125._24_4_ =
                 (uint)(bVar57 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar57 >> 6) * 0x7f800000;
            auVar125._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar125,auVar125,0xb1);
            auVar91 = vminps_avx(auVar125,auVar91);
            auVar92 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar92);
            auVar92 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar92);
            uVar12 = vcmpps_avx512vl(auVar125,auVar91,0);
            bVar53 = (byte)uVar12 & bVar57;
            bVar59 = bVar57;
            if (bVar53 != 0) {
              bVar59 = bVar53;
            }
            iVar15 = 0;
            for (uVar65 = (uint)bVar59; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar59 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar65 = *(uint *)(local_520 + (uint)(iVar15 << 2));
            uVar128 = *(uint *)(local_440 + (uint)(iVar15 << 2));
            fVar151 = auVar11._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              auVar249 = ZEXT1664(auVar249._0_16_);
              fVar151 = sqrtf((float)local_9a0._0_4_);
            }
            uVar58 = (ulong)bVar59;
            auVar70 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar69 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar66 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar74 = vminps_avx(auVar70,auVar66);
            auVar70 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar66 = vmaxps_avx(auVar69,auVar70);
            auVar200._8_4_ = 0x7fffffff;
            auVar200._0_8_ = 0x7fffffff7fffffff;
            auVar200._12_4_ = 0x7fffffff;
            auVar69 = vandps_avx(auVar74,auVar200);
            auVar70 = vandps_avx(auVar66,auVar200);
            auVar69 = vmaxps_avx(auVar69,auVar70);
            auVar70 = vmovshdup_avx(auVar69);
            auVar70 = vmaxss_avx(auVar70,auVar69);
            auVar69 = vshufpd_avx(auVar69,auVar69,1);
            auVar69 = vmaxss_avx(auVar69,auVar70);
            fVar164 = auVar69._0_4_ * 1.9073486e-06;
            local_920 = vshufps_avx(auVar66,auVar66,0xff);
            auVar69 = vinsertps_avx(ZEXT416(uVar128),ZEXT416(uVar65),0x10);
            auVar150 = ZEXT1664(auVar69);
            uVar60 = 0;
            while( true ) {
              bVar53 = (byte)uVar58;
              if (uVar60 == 5) break;
              uVar153 = auVar150._0_4_;
              auVar137._4_4_ = uVar153;
              auVar137._0_4_ = uVar153;
              auVar137._8_4_ = uVar153;
              auVar137._12_4_ = uVar153;
              auVar70 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_990);
              auVar66 = auVar150._0_16_;
              auVar69 = vmovshdup_avx(auVar66);
              local_7e0._0_16_ = auVar69;
              fVar199 = 1.0 - auVar69._0_4_;
              auVar69 = vshufps_avx(auVar66,auVar66,0x55);
              fVar166 = auVar69._0_4_;
              auVar175._0_4_ = local_8a0._0_4_ * fVar166;
              fVar168 = auVar69._4_4_;
              auVar175._4_4_ = local_8a0._4_4_ * fVar168;
              fVar136 = auVar69._8_4_;
              auVar175._8_4_ = local_8a0._8_4_ * fVar136;
              fVar170 = auVar69._12_4_;
              auVar175._12_4_ = local_8a0._12_4_ * fVar170;
              _local_7c0 = ZEXT416((uint)fVar199);
              auVar201._4_4_ = fVar199;
              auVar201._0_4_ = fVar199;
              auVar201._8_4_ = fVar199;
              auVar201._12_4_ = fVar199;
              auVar69 = vfmadd231ps_fma(auVar175,auVar201,local_860._0_16_);
              auVar214._0_4_ = local_880._0_4_ * fVar166;
              auVar214._4_4_ = local_880._4_4_ * fVar168;
              auVar214._8_4_ = local_880._8_4_ * fVar136;
              auVar214._12_4_ = local_880._12_4_ * fVar170;
              auVar66 = vfmadd231ps_fma(auVar214,auVar201,local_8a0._0_16_);
              auVar221._0_4_ = fVar166 * (float)local_8c0._0_4_;
              auVar221._4_4_ = fVar168 * (float)local_8c0._4_4_;
              auVar221._8_4_ = fVar136 * fStack_8b8;
              auVar221._12_4_ = fVar170 * fStack_8b4;
              auVar74 = vfmadd231ps_fma(auVar221,auVar201,local_880._0_16_);
              auVar229._0_4_ = fVar166 * auVar66._0_4_;
              auVar229._4_4_ = fVar168 * auVar66._4_4_;
              auVar229._8_4_ = fVar136 * auVar66._8_4_;
              auVar229._12_4_ = fVar170 * auVar66._12_4_;
              auVar69 = vfmadd231ps_fma(auVar229,auVar201,auVar69);
              auVar176._0_4_ = fVar166 * auVar74._0_4_;
              auVar176._4_4_ = fVar168 * auVar74._4_4_;
              auVar176._8_4_ = fVar136 * auVar74._8_4_;
              auVar176._12_4_ = fVar170 * auVar74._12_4_;
              auVar66 = vfmadd231ps_fma(auVar176,auVar201,auVar66);
              auVar215._0_4_ = fVar166 * auVar66._0_4_;
              auVar215._4_4_ = fVar168 * auVar66._4_4_;
              auVar215._8_4_ = fVar136 * auVar66._8_4_;
              auVar215._12_4_ = fVar170 * auVar66._12_4_;
              auVar74 = vfmadd231ps_fma(auVar215,auVar69,auVar201);
              auVar69 = vsubps_avx(auVar66,auVar69);
              auVar17._8_4_ = 0x40400000;
              auVar17._0_8_ = 0x4040000040400000;
              auVar17._12_4_ = 0x40400000;
              auVar66 = vmulps_avx512vl(auVar69,auVar17);
              local_7a0._0_16_ = auVar74;
              auVar70 = vsubps_avx(auVar70,auVar74);
              auVar69 = vdpps_avx(auVar70,auVar70,0x7f);
              fVar166 = auVar69._0_4_;
              local_780 = auVar150;
              if (fVar166 < 0.0) {
                auVar241._0_4_ = sqrtf(fVar166);
                auVar241._4_60_ = extraout_var;
                auVar74 = auVar241._0_16_;
                uVar58 = extraout_RAX;
              }
              else {
                auVar74 = vsqrtss_avx(auVar69,auVar69);
              }
              local_800._0_16_ = vdpps_avx(auVar66,auVar66,0x7f);
              fVar168 = local_800._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar168;
              local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              fVar136 = local_9c0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar67 = vxorps_avx512vl(local_800._0_16_,auVar18);
              auVar71 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar71._0_4_;
              local_960._0_4_ = auVar74._0_4_;
              if (fVar168 < auVar67._0_4_) {
                fVar170 = sqrtf(fVar168);
                auVar74 = ZEXT416((uint)local_960._0_4_);
                uVar58 = extraout_RAX_00;
              }
              else {
                auVar71 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar170 = auVar71._0_4_;
              }
              fVar199 = local_9c0._0_4_;
              fVar168 = fVar136 * 1.5 + fVar168 * -0.5 * fVar199 * fVar199 * fVar199;
              auVar138._0_4_ = auVar66._0_4_ * fVar168;
              auVar138._4_4_ = auVar66._4_4_ * fVar168;
              auVar138._8_4_ = auVar66._8_4_ * fVar168;
              auVar138._12_4_ = auVar66._12_4_ * fVar168;
              local_9c0._0_16_ = vdpps_avx(auVar70,auVar138,0x7f);
              fVar199 = auVar74._0_4_;
              auVar139._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
              auVar139._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
              auVar139._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
              auVar139._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
              auVar69 = vsubps_avx(auVar69,auVar139);
              fVar136 = auVar69._0_4_;
              auVar154._4_12_ = ZEXT812(0) << 0x20;
              auVar154._0_4_ = fVar136;
              auVar71 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar154);
              auVar67 = vmulss_avx512f(auVar71,ZEXT416(0x3fc00000));
              auVar72 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              if (fVar136 < 0.0) {
                local_8e0._0_4_ = fVar170;
                local_900._0_4_ = auVar67._0_4_;
                local_910._4_4_ = fVar168;
                local_910._0_4_ = fVar168;
                fStack_908 = fVar168;
                fStack_904 = fVar168;
                local_8f0 = auVar71;
                fVar136 = sqrtf(fVar136);
                auVar72 = ZEXT416(auVar72._0_4_);
                auVar67 = ZEXT416((uint)local_900._0_4_);
                auVar74 = ZEXT416((uint)local_960._0_4_);
                uVar58 = extraout_RAX_01;
                auVar71 = local_8f0;
                fVar168 = (float)local_910._0_4_;
                fVar173 = (float)local_910._4_4_;
                fVar152 = fStack_908;
                fVar165 = fStack_904;
                fVar170 = (float)local_8e0._0_4_;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar136 = auVar69._0_4_;
                fVar173 = fVar168;
                fVar152 = fVar168;
                fVar165 = fVar168;
              }
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar167 = auVar69._0_4_ * 6.0;
              fVar169 = local_7e0._0_4_ * 6.0;
              auVar202._0_4_ = fVar169 * (float)local_8c0._0_4_;
              auVar202._4_4_ = fVar169 * (float)local_8c0._4_4_;
              auVar202._8_4_ = fVar169 * fStack_8b8;
              auVar202._12_4_ = fVar169 * fStack_8b4;
              auVar178._4_4_ = fVar167;
              auVar178._0_4_ = fVar167;
              auVar178._8_4_ = fVar167;
              auVar178._12_4_ = fVar167;
              auVar69 = vfmadd132ps_fma(auVar178,auVar202,local_880._0_16_);
              fVar167 = auVar75._0_4_ * 6.0;
              auVar155._4_4_ = fVar167;
              auVar155._0_4_ = fVar167;
              auVar155._8_4_ = fVar167;
              auVar155._12_4_ = fVar167;
              auVar69 = vfmadd132ps_fma(auVar155,auVar69,local_8a0._0_16_);
              fVar167 = local_7c0._0_4_ * 6.0;
              auVar179._4_4_ = fVar167;
              auVar179._0_4_ = fVar167;
              auVar179._8_4_ = fVar167;
              auVar179._12_4_ = fVar167;
              auVar69 = vfmadd132ps_fma(auVar179,auVar69,local_860._0_16_);
              auVar156._0_4_ = auVar69._0_4_ * (float)local_800._0_4_;
              auVar156._4_4_ = auVar69._4_4_ * (float)local_800._0_4_;
              auVar156._8_4_ = auVar69._8_4_ * (float)local_800._0_4_;
              auVar156._12_4_ = auVar69._12_4_ * (float)local_800._0_4_;
              auVar69 = vdpps_avx(auVar66,auVar69,0x7f);
              fVar167 = auVar69._0_4_;
              auVar180._0_4_ = auVar66._0_4_ * fVar167;
              auVar180._4_4_ = auVar66._4_4_ * fVar167;
              auVar180._8_4_ = auVar66._8_4_ * fVar167;
              auVar180._12_4_ = auVar66._12_4_ * fVar167;
              auVar69 = vsubps_avx(auVar156,auVar180);
              fVar167 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar75 = vmaxss_avx(ZEXT416((uint)fVar164),
                                   ZEXT416((uint)(local_780._0_4_ * fVar151 * 1.9073486e-06)));
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar73 = vxorps_avx512vl(auVar66,auVar19);
              auVar181._0_4_ = fVar168 * auVar69._0_4_ * fVar167;
              auVar181._4_4_ = fVar173 * auVar69._4_4_ * fVar167;
              auVar181._8_4_ = fVar152 * auVar69._8_4_ * fVar167;
              auVar181._12_4_ = fVar165 * auVar69._12_4_ * fVar167;
              auVar249 = ZEXT1664(auVar138);
              auVar69 = vdpps_avx(auVar73,auVar138,0x7f);
              auVar76 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar164),auVar75);
              auVar74 = vdpps_avx(auVar70,auVar181,0x7f);
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(fVar199 + 1.0)),
                                        ZEXT416((uint)(fVar164 / fVar170)),auVar76);
              fVar168 = auVar69._0_4_ + auVar74._0_4_;
              auVar69 = vdpps_avx(local_990,auVar138,0x7f);
              auVar74 = vdpps_avx(auVar70,auVar73,0x7f);
              auVar72 = vmulss_avx512f(auVar72,auVar71);
              auVar71 = vmulss_avx512f(auVar71,auVar71);
              auVar72 = vaddss_avx512f(auVar67,ZEXT416((uint)(auVar72._0_4_ * auVar71._0_4_)));
              auVar71 = vdpps_avx(auVar70,local_990,0x7f);
              auVar73 = vfnmadd231ss_avx512f(auVar74,local_9c0._0_16_,ZEXT416((uint)fVar168));
              auVar71 = vfnmadd231ss_avx512f(auVar71,local_9c0._0_16_,auVar69);
              auVar74 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar136 = fVar136 - auVar74._0_4_;
              auVar67 = vshufps_avx(auVar66,auVar66,0xff);
              auVar74 = vfmsub213ss_fma(auVar73,auVar72,auVar67);
              auVar234._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar234._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar234._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar71 = ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_));
              auVar72 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar168),auVar71);
              auVar74 = vinsertps_avx(auVar234,auVar71,0x1c);
              auVar222._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar69._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar69._12_4_ ^ 0x80000000;
              auVar71 = vinsertps_avx(ZEXT416((uint)fVar168),auVar222,0x10);
              auVar203._0_4_ = auVar72._0_4_;
              auVar203._4_4_ = auVar203._0_4_;
              auVar203._8_4_ = auVar203._0_4_;
              auVar203._12_4_ = auVar203._0_4_;
              auVar69 = vdivps_avx(auVar74,auVar203);
              auVar74 = vdivps_avx(auVar71,auVar203);
              auVar71 = vbroadcastss_avx512vl(local_9c0._0_16_);
              auVar204._0_4_ = auVar71._0_4_ * auVar69._0_4_ + fVar136 * auVar74._0_4_;
              auVar204._4_4_ = auVar71._4_4_ * auVar69._4_4_ + fVar136 * auVar74._4_4_;
              auVar204._8_4_ = auVar71._8_4_ * auVar69._8_4_ + fVar136 * auVar74._8_4_;
              auVar204._12_4_ = auVar71._12_4_ * auVar69._12_4_ + fVar136 * auVar74._12_4_;
              auVar69 = vsubps_avx(local_780._0_16_,auVar204);
              auVar150 = ZEXT1664(auVar69);
              auVar20._8_4_ = 0x7fffffff;
              auVar20._0_8_ = 0x7fffffff7fffffff;
              auVar20._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(local_9c0._0_16_,auVar20);
              if (auVar74._0_4_ < auVar76._0_4_) {
                auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ + auVar75._0_4_)),local_920,
                                          ZEXT416(0x36000000));
                auVar21._8_4_ = 0x7fffffff;
                auVar21._0_8_ = 0x7fffffff7fffffff;
                auVar21._12_4_ = 0x7fffffff;
                auVar71 = vandps_avx512vl(ZEXT416((uint)fVar136),auVar21);
                if (auVar71._0_4_ < auVar74._0_4_) {
                  bVar62 = uVar60 < 5;
                  fVar151 = auVar69._0_4_ + (float)local_930._0_4_;
                  if ((fVar248 <= fVar151) &&
                     (fVar164 = *(float *)(ray + k * 4 + 0x200), fVar151 <= fVar164)) {
                    auVar69 = vmovshdup_avx(auVar69);
                    bVar53 = 0;
                    if ((auVar69._0_4_ < 0.0) || (1.0 < auVar69._0_4_)) goto LAB_01a82b07;
                    auVar205._0_12_ = ZEXT812(0);
                    auVar205._12_4_ = 0;
                    auVar182._4_8_ = auVar205._4_8_;
                    auVar182._0_4_ = fVar166;
                    auVar182._12_4_ = 0;
                    auVar69 = vrsqrt14ss_avx512f(auVar205,auVar182);
                    fVar168 = auVar69._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar53 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01a82b07;
                      fVar166 = fVar168 * 1.5 + fVar166 * -0.5 * fVar168 * fVar168 * fVar168;
                      auVar183._0_4_ = auVar70._0_4_ * fVar166;
                      auVar183._4_4_ = auVar70._4_4_ * fVar166;
                      auVar183._8_4_ = auVar70._8_4_ * fVar166;
                      auVar183._12_4_ = auVar70._12_4_ * fVar166;
                      auVar74 = vfmadd213ps_fma(auVar67,auVar183,auVar66);
                      auVar69 = vshufps_avx(auVar183,auVar183,0xc9);
                      auVar70 = vshufps_avx(auVar66,auVar66,0xc9);
                      auVar184._0_4_ = auVar183._0_4_ * auVar70._0_4_;
                      auVar184._4_4_ = auVar183._4_4_ * auVar70._4_4_;
                      auVar184._8_4_ = auVar183._8_4_ * auVar70._8_4_;
                      auVar184._12_4_ = auVar183._12_4_ * auVar70._12_4_;
                      auVar66 = vfmsub231ps_fma(auVar184,auVar66,auVar69);
                      auVar69 = vshufps_avx(auVar66,auVar66,0xc9);
                      auVar70 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar66 = vshufps_avx(auVar66,auVar66,0xd2);
                      auVar140._0_4_ = auVar74._0_4_ * auVar66._0_4_;
                      auVar140._4_4_ = auVar74._4_4_ * auVar66._4_4_;
                      auVar140._8_4_ = auVar74._8_4_ * auVar66._8_4_;
                      auVar140._12_4_ = auVar74._12_4_ * auVar66._12_4_;
                      auVar69 = vfmsub231ps_fma(auVar140,auVar69,auVar70);
                      auVar233 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar233,auVar150);
                      auVar150 = vpermps_avx512f(auVar233,ZEXT1664(auVar69));
                      auVar233 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar233,ZEXT1664(auVar69));
                      local_380 = vbroadcastss_avx512f(auVar69);
                      local_400[0] = (RTCHitN)auVar150[0];
                      local_400[1] = (RTCHitN)auVar150[1];
                      local_400[2] = (RTCHitN)auVar150[2];
                      local_400[3] = (RTCHitN)auVar150[3];
                      local_400[4] = (RTCHitN)auVar150[4];
                      local_400[5] = (RTCHitN)auVar150[5];
                      local_400[6] = (RTCHitN)auVar150[6];
                      local_400[7] = (RTCHitN)auVar150[7];
                      local_400[8] = (RTCHitN)auVar150[8];
                      local_400[9] = (RTCHitN)auVar150[9];
                      local_400[10] = (RTCHitN)auVar150[10];
                      local_400[0xb] = (RTCHitN)auVar150[0xb];
                      local_400[0xc] = (RTCHitN)auVar150[0xc];
                      local_400[0xd] = (RTCHitN)auVar150[0xd];
                      local_400[0xe] = (RTCHitN)auVar150[0xe];
                      local_400[0xf] = (RTCHitN)auVar150[0xf];
                      local_400[0x10] = (RTCHitN)auVar150[0x10];
                      local_400[0x11] = (RTCHitN)auVar150[0x11];
                      local_400[0x12] = (RTCHitN)auVar150[0x12];
                      local_400[0x13] = (RTCHitN)auVar150[0x13];
                      local_400[0x14] = (RTCHitN)auVar150[0x14];
                      local_400[0x15] = (RTCHitN)auVar150[0x15];
                      local_400[0x16] = (RTCHitN)auVar150[0x16];
                      local_400[0x17] = (RTCHitN)auVar150[0x17];
                      local_400[0x18] = (RTCHitN)auVar150[0x18];
                      local_400[0x19] = (RTCHitN)auVar150[0x19];
                      local_400[0x1a] = (RTCHitN)auVar150[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar150[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar150[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar150[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar150[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar150[0x1f];
                      local_400[0x20] = (RTCHitN)auVar150[0x20];
                      local_400[0x21] = (RTCHitN)auVar150[0x21];
                      local_400[0x22] = (RTCHitN)auVar150[0x22];
                      local_400[0x23] = (RTCHitN)auVar150[0x23];
                      local_400[0x24] = (RTCHitN)auVar150[0x24];
                      local_400[0x25] = (RTCHitN)auVar150[0x25];
                      local_400[0x26] = (RTCHitN)auVar150[0x26];
                      local_400[0x27] = (RTCHitN)auVar150[0x27];
                      local_400[0x28] = (RTCHitN)auVar150[0x28];
                      local_400[0x29] = (RTCHitN)auVar150[0x29];
                      local_400[0x2a] = (RTCHitN)auVar150[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar150[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar150[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar150[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar150[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar150[0x2f];
                      local_400[0x30] = (RTCHitN)auVar150[0x30];
                      local_400[0x31] = (RTCHitN)auVar150[0x31];
                      local_400[0x32] = (RTCHitN)auVar150[0x32];
                      local_400[0x33] = (RTCHitN)auVar150[0x33];
                      local_400[0x34] = (RTCHitN)auVar150[0x34];
                      local_400[0x35] = (RTCHitN)auVar150[0x35];
                      local_400[0x36] = (RTCHitN)auVar150[0x36];
                      local_400[0x37] = (RTCHitN)auVar150[0x37];
                      local_400[0x38] = (RTCHitN)auVar150[0x38];
                      local_400[0x39] = (RTCHitN)auVar150[0x39];
                      local_400[0x3a] = (RTCHitN)auVar150[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar150[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar150[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar150[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar150[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar150[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar150 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar150);
                      vpcmpeqd_avx2(auVar150._0_32_,auVar150._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar151;
                      auVar150 = vmovdqa64_avx512f(local_500);
                      local_6c0 = vmovdqa64_avx512f(auVar150);
                      local_ad0.valid = (int *)local_6c0;
                      local_ad0.geometryUserPtr = pGVar2->userPtr;
                      local_ad0.context = context->user;
                      local_ad0.hit = local_400;
                      local_ad0.N = 0x10;
                      local_ad0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar249 = ZEXT1664(auVar138);
                        (*pGVar2->occlusionFilterN)(&local_ad0);
                        auVar150 = vmovdqa64_avx512f(local_6c0);
                      }
                      uVar12 = vptestmd_avx512f(auVar150,auVar150);
                      if ((short)uVar12 != 0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar249 = ZEXT1664(auVar249._0_16_);
                          (*p_Var3)(&local_ad0);
                          auVar150 = vmovdqa64_avx512f(local_6c0);
                        }
                        uVar58 = vptestmd_avx512f(auVar150,auVar150);
                        auVar150 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar58 & 1);
                        auVar245._0_4_ =
                             (uint)bVar4 * auVar150._0_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x200);
                        bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
                        auVar245._4_4_ =
                             (uint)bVar4 * auVar150._4_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x204);
                        bVar4 = (bool)((byte)(uVar58 >> 2) & 1);
                        auVar245._8_4_ =
                             (uint)bVar4 * auVar150._8_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x208);
                        bVar4 = (bool)((byte)(uVar58 >> 3) & 1);
                        auVar245._12_4_ =
                             (uint)bVar4 * auVar150._12_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x20c);
                        bVar4 = (bool)((byte)(uVar58 >> 4) & 1);
                        auVar245._16_4_ =
                             (uint)bVar4 * auVar150._16_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x210);
                        bVar4 = (bool)((byte)(uVar58 >> 5) & 1);
                        auVar245._20_4_ =
                             (uint)bVar4 * auVar150._20_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x214);
                        bVar4 = (bool)((byte)(uVar58 >> 6) & 1);
                        auVar245._24_4_ =
                             (uint)bVar4 * auVar150._24_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x218);
                        bVar4 = (bool)((byte)(uVar58 >> 7) & 1);
                        auVar245._28_4_ =
                             (uint)bVar4 * auVar150._28_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x21c);
                        bVar4 = (bool)((byte)(uVar58 >> 8) & 1);
                        auVar245._32_4_ =
                             (uint)bVar4 * auVar150._32_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x220);
                        bVar4 = (bool)((byte)(uVar58 >> 9) & 1);
                        auVar245._36_4_ =
                             (uint)bVar4 * auVar150._36_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x224);
                        bVar4 = (bool)((byte)(uVar58 >> 10) & 1);
                        auVar245._40_4_ =
                             (uint)bVar4 * auVar150._40_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x228);
                        bVar4 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        auVar245._44_4_ =
                             (uint)bVar4 * auVar150._44_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x22c);
                        bVar4 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        auVar245._48_4_ =
                             (uint)bVar4 * auVar150._48_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x230);
                        bVar4 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        auVar245._52_4_ =
                             (uint)bVar4 * auVar150._52_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x234);
                        bVar4 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        auVar245._56_4_ =
                             (uint)bVar4 * auVar150._56_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x238);
                        bVar4 = SUB81(uVar58 >> 0xf,0);
                        auVar245._60_4_ =
                             (uint)bVar4 * auVar150._60_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x23c);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x200) = auVar245;
                        bVar53 = 1;
                        if ((short)uVar58 != 0) goto LAB_01a82b07;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar164;
                    }
                  }
                  bVar53 = 0;
                  goto LAB_01a82b07;
                }
              }
              uVar60 = uVar60 + 1;
            }
            bVar62 = false;
LAB_01a82b07:
            bVar54 = bVar54 | bVar62 & bVar53;
            uVar153 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar226._4_4_ = uVar153;
            auVar226._0_4_ = uVar153;
            auVar226._8_4_ = uVar153;
            auVar226._12_4_ = uVar153;
            auVar226._16_4_ = uVar153;
            auVar226._20_4_ = uVar153;
            auVar226._24_4_ = uVar153;
            auVar226._28_4_ = uVar153;
            auVar150 = ZEXT3264(auVar226);
            auVar48._4_4_ = fStack_65c;
            auVar48._0_4_ = local_660;
            auVar48._8_4_ = fStack_658;
            auVar48._12_4_ = fStack_654;
            auVar48._16_4_ = fStack_650;
            auVar48._20_4_ = fStack_64c;
            auVar48._24_4_ = fStack_648;
            auVar48._28_4_ = fStack_644;
            uVar12 = vcmpps_avx512vl(auVar226,auVar48,0xd);
          }
          auVar146._0_4_ = (float)local_980._0_4_ + (float)local_680._0_4_;
          auVar146._4_4_ = (float)local_980._4_4_ + (float)local_680._4_4_;
          auVar146._8_4_ = fStack_978 + fStack_678;
          auVar146._12_4_ = fStack_974 + fStack_674;
          auVar146._16_4_ = fStack_970 + fStack_670;
          auVar146._20_4_ = fStack_96c + fStack_66c;
          auVar146._24_4_ = fStack_968 + fStack_668;
          auVar146._28_4_ = fStack_964 + fStack_664;
          uVar153 = auVar150._0_4_;
          auVar160._4_4_ = uVar153;
          auVar160._0_4_ = uVar153;
          auVar160._8_4_ = uVar153;
          auVar160._12_4_ = uVar153;
          auVar160._16_4_ = uVar153;
          auVar160._20_4_ = uVar153;
          auVar160._24_4_ = uVar153;
          auVar160._28_4_ = uVar153;
          uVar12 = vcmpps_avx512vl(auVar146,auVar160,2);
          auVar147._8_4_ = 2;
          auVar147._0_8_ = 0x200000002;
          auVar147._12_4_ = 2;
          auVar147._16_4_ = 2;
          auVar147._20_4_ = 2;
          auVar147._24_4_ = 2;
          auVar147._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar91 = vpblendmd_avx512vl(auVar147,auVar31);
          local_680._0_4_ = (uint)(bVar52 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar52 & 1) * 2;
          bVar62 = (bool)(bVar52 >> 1 & 1);
          local_680._4_4_ = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * 2;
          bVar62 = (bool)(bVar52 >> 2 & 1);
          fStack_678 = (float)((uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 3 & 1);
          fStack_674 = (float)((uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 4 & 1);
          fStack_670 = (float)((uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 5 & 1);
          fStack_66c = (float)((uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * 2);
          bVar62 = (bool)(bVar52 >> 6 & 1);
          fStack_668 = (float)((uint)bVar62 * auVar91._24_4_ | (uint)!bVar62 * 2);
          fStack_664 = (float)((uint)(bVar52 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar52 >> 7) * 2
                              );
          bVar51 = (byte)uVar13 & bVar51 & (byte)uVar12;
          uVar12 = vpcmpd_avx512vl(_local_680,local_620,2);
          local_6e0 = _local_600;
          local_660 = (float)local_980._0_4_ + (float)local_600._0_4_;
          fStack_65c = (float)local_980._4_4_ + (float)local_600._4_4_;
          fStack_658 = fStack_978 + fStack_5f8;
          fStack_654 = fStack_974 + fStack_5f4;
          fStack_650 = fStack_970 + fStack_5f0;
          fStack_64c = fStack_96c + fStack_5ec;
          fStack_648 = fStack_968 + fStack_5e8;
          fStack_644 = fStack_964 + fStack_5e4;
          auVar250 = ZEXT3264(local_9e0);
          auVar245 = ZEXT3264(local_a00);
          auVar247 = ZEXT3264(local_a20);
          auVar241 = ZEXT3264(local_a40);
          auVar233 = ZEXT3264(local_a60);
          auVar237 = ZEXT3264(local_a80);
          auVar239 = ZEXT3264(local_aa0);
          for (bVar57 = (byte)uVar12 & bVar51; bVar57 != 0; bVar57 = ~bVar52 & bVar57 & (byte)uVar12
              ) {
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar91 = vblendmps_avx512vl(auVar148,local_6e0);
            auVar126._0_4_ =
                 (uint)(bVar57 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar62 * auVar91._4_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar62 * auVar91._8_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar62 * auVar91._12_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar62 * auVar91._16_4_ | (uint)!bVar62 * 0x7f800000;
            bVar62 = (bool)(bVar57 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar62 * auVar91._20_4_ | (uint)!bVar62 * 0x7f800000;
            auVar126._24_4_ =
                 (uint)(bVar57 >> 6) * auVar91._24_4_ | (uint)!(bool)(bVar57 >> 6) * 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar91 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar91 = vminps_avx(auVar126,auVar91);
            auVar92 = vshufpd_avx(auVar91,auVar91,5);
            auVar91 = vminps_avx(auVar91,auVar92);
            auVar92 = vpermpd_avx2(auVar91,0x4e);
            auVar91 = vminps_avx(auVar91,auVar92);
            uVar12 = vcmpps_avx512vl(auVar126,auVar91,0);
            bVar59 = (byte)uVar12 & bVar57;
            bVar52 = bVar57;
            if (bVar59 != 0) {
              bVar52 = bVar59;
            }
            iVar15 = 0;
            for (uVar65 = (uint)bVar52; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar52 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar65 = *(uint *)(local_540 + (uint)(iVar15 << 2));
            uVar128 = *(uint *)(local_5e0 + (uint)(iVar15 << 2));
            fVar151 = auVar68._0_4_;
            if ((float)local_9a0._0_4_ < 0.0) {
              auVar249 = ZEXT1664(auVar249._0_16_);
              fVar151 = sqrtf((float)local_9a0._0_4_);
              auVar239 = ZEXT3264(local_aa0);
              auVar237 = ZEXT3264(local_a80);
              auVar233 = ZEXT3264(local_a60);
              auVar241 = ZEXT3264(local_a40);
              auVar247 = ZEXT3264(local_a20);
              auVar245 = ZEXT3264(local_a00);
              auVar250 = ZEXT3264(local_9e0);
            }
            uVar58 = (ulong)bVar52;
            auVar70 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar69 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar66 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar74 = vminps_avx(auVar70,auVar66);
            auVar70 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar66 = vmaxps_avx(auVar69,auVar70);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar69 = vandps_avx(auVar74,auVar206);
            auVar70 = vandps_avx(auVar66,auVar206);
            auVar69 = vmaxps_avx(auVar69,auVar70);
            auVar70 = vmovshdup_avx(auVar69);
            auVar70 = vmaxss_avx(auVar70,auVar69);
            auVar69 = vshufpd_avx(auVar69,auVar69,1);
            auVar69 = vmaxss_avx(auVar69,auVar70);
            fVar164 = auVar69._0_4_ * 1.9073486e-06;
            local_920 = vshufps_avx(auVar66,auVar66,0xff);
            auVar69 = vinsertps_avx(ZEXT416(uVar128),ZEXT416(uVar65),0x10);
            auVar150 = ZEXT1664(auVar69);
            uVar60 = 0;
            while( true ) {
              bVar59 = (byte)uVar58;
              if (uVar60 == 5) break;
              uVar153 = auVar150._0_4_;
              auVar141._4_4_ = uVar153;
              auVar141._0_4_ = uVar153;
              auVar141._8_4_ = uVar153;
              auVar141._12_4_ = uVar153;
              auVar70 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_990);
              auVar66 = auVar150._0_16_;
              auVar69 = vmovshdup_avx(auVar66);
              local_7e0._0_16_ = auVar69;
              fVar199 = 1.0 - auVar69._0_4_;
              auVar69 = vshufps_avx(auVar66,auVar66,0x55);
              fVar166 = auVar69._0_4_;
              auVar185._0_4_ = local_8a0._0_4_ * fVar166;
              fVar168 = auVar69._4_4_;
              auVar185._4_4_ = local_8a0._4_4_ * fVar168;
              fVar136 = auVar69._8_4_;
              auVar185._8_4_ = local_8a0._8_4_ * fVar136;
              fVar170 = auVar69._12_4_;
              auVar185._12_4_ = local_8a0._12_4_ * fVar170;
              _local_7c0 = ZEXT416((uint)fVar199);
              auVar207._4_4_ = fVar199;
              auVar207._0_4_ = fVar199;
              auVar207._8_4_ = fVar199;
              auVar207._12_4_ = fVar199;
              auVar69 = vfmadd231ps_fma(auVar185,auVar207,local_860._0_16_);
              auVar216._0_4_ = local_880._0_4_ * fVar166;
              auVar216._4_4_ = local_880._4_4_ * fVar168;
              auVar216._8_4_ = local_880._8_4_ * fVar136;
              auVar216._12_4_ = local_880._12_4_ * fVar170;
              auVar66 = vfmadd231ps_fma(auVar216,auVar207,local_8a0._0_16_);
              auVar223._0_4_ = fVar166 * (float)local_8c0._0_4_;
              auVar223._4_4_ = fVar168 * (float)local_8c0._4_4_;
              auVar223._8_4_ = fVar136 * fStack_8b8;
              auVar223._12_4_ = fVar170 * fStack_8b4;
              auVar74 = vfmadd231ps_fma(auVar223,auVar207,local_880._0_16_);
              auVar230._0_4_ = fVar166 * auVar66._0_4_;
              auVar230._4_4_ = fVar168 * auVar66._4_4_;
              auVar230._8_4_ = fVar136 * auVar66._8_4_;
              auVar230._12_4_ = fVar170 * auVar66._12_4_;
              auVar69 = vfmadd231ps_fma(auVar230,auVar207,auVar69);
              auVar186._0_4_ = fVar166 * auVar74._0_4_;
              auVar186._4_4_ = fVar168 * auVar74._4_4_;
              auVar186._8_4_ = fVar136 * auVar74._8_4_;
              auVar186._12_4_ = fVar170 * auVar74._12_4_;
              auVar66 = vfmadd231ps_fma(auVar186,auVar207,auVar66);
              auVar217._0_4_ = fVar166 * auVar66._0_4_;
              auVar217._4_4_ = fVar168 * auVar66._4_4_;
              auVar217._8_4_ = fVar136 * auVar66._8_4_;
              auVar217._12_4_ = fVar170 * auVar66._12_4_;
              auVar74 = vfmadd231ps_fma(auVar217,auVar69,auVar207);
              auVar69 = vsubps_avx(auVar66,auVar69);
              auVar22._8_4_ = 0x40400000;
              auVar22._0_8_ = 0x4040000040400000;
              auVar22._12_4_ = 0x40400000;
              auVar66 = vmulps_avx512vl(auVar69,auVar22);
              local_7a0._0_16_ = auVar74;
              auVar70 = vsubps_avx(auVar70,auVar74);
              auVar69 = vdpps_avx(auVar70,auVar70,0x7f);
              fVar166 = auVar69._0_4_;
              local_780 = auVar150;
              if (fVar166 < 0.0) {
                auVar239._0_4_ = sqrtf(fVar166);
                auVar239._4_60_ = extraout_var_00;
                auVar74 = auVar239._0_16_;
                uVar58 = extraout_RAX_02;
              }
              else {
                auVar74 = vsqrtss_avx(auVar69,auVar69);
              }
              local_800._0_16_ = vdpps_avx(auVar66,auVar66,0x7f);
              fVar168 = local_800._0_4_;
              auVar187._4_12_ = ZEXT812(0) << 0x20;
              auVar187._0_4_ = fVar168;
              local_9c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              fVar136 = local_9c0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar67 = vxorps_avx512vl(local_800._0_16_,auVar23);
              auVar71 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar71._0_4_;
              local_960._0_4_ = auVar74._0_4_;
              if (fVar168 < auVar67._0_4_) {
                fVar170 = sqrtf(fVar168);
                auVar74 = ZEXT416((uint)local_960._0_4_);
                uVar58 = extraout_RAX_03;
              }
              else {
                auVar71 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar170 = auVar71._0_4_;
              }
              fVar199 = local_9c0._0_4_;
              auVar72 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar136 * 1.5 +
                                                 fVar168 * -0.5 * fVar199 * fVar199 * fVar199)));
              auVar71 = vmulps_avx512vl(auVar72,auVar66);
              local_9c0._0_16_ = vdpps_avx(auVar71,auVar70,0x7f);
              auVar75 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar142._0_4_ = local_9c0._0_4_ * local_9c0._0_4_;
              auVar142._4_4_ = local_9c0._4_4_ * local_9c0._4_4_;
              auVar142._8_4_ = local_9c0._8_4_ * local_9c0._8_4_;
              auVar142._12_4_ = local_9c0._12_4_ * local_9c0._12_4_;
              auVar69 = vsubps_avx(auVar69,auVar142);
              fVar168 = auVar69._0_4_;
              auVar157._4_12_ = ZEXT812(0) << 0x20;
              auVar157._0_4_ = fVar168;
              auVar67 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar157);
              auVar76 = vmulss_avx512f(auVar67,ZEXT416(0x3fc00000));
              auVar73 = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
              uVar64 = fVar168 == 0.0;
              uVar63 = fVar168 < 0.0;
              if ((bool)uVar63) {
                local_8f0._0_4_ = auVar76._0_4_;
                _local_910 = auVar72;
                local_900 = auVar71;
                local_8e0 = auVar67;
                fVar168 = sqrtf(fVar168);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar76 = ZEXT416((uint)local_8f0._0_4_);
                auVar74 = ZEXT416((uint)local_960._0_4_);
                auVar75 = ZEXT416(auVar75._0_4_);
                uVar58 = extraout_RAX_04;
                auVar71 = local_900;
                auVar67 = local_8e0;
                auVar72 = _local_910;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar168 = auVar69._0_4_;
              }
              auVar249 = ZEXT1664(auVar71);
              auVar250 = ZEXT3264(local_9e0);
              auVar245 = ZEXT3264(local_a00);
              auVar247 = ZEXT3264(local_a20);
              auVar241 = ZEXT3264(local_a40);
              auVar228 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_)
              ;
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar136 = auVar69._0_4_ * 6.0;
              fVar199 = local_7e0._0_4_ * 6.0;
              auVar208._0_4_ = fVar199 * (float)local_8c0._0_4_;
              auVar208._4_4_ = fVar199 * (float)local_8c0._4_4_;
              auVar208._8_4_ = fVar199 * fStack_8b8;
              auVar208._12_4_ = fVar199 * fStack_8b4;
              auVar188._4_4_ = fVar136;
              auVar188._0_4_ = fVar136;
              auVar188._8_4_ = fVar136;
              auVar188._12_4_ = fVar136;
              auVar69 = vfmadd132ps_fma(auVar188,auVar208,local_880._0_16_);
              fVar136 = auVar228._0_4_ * 6.0;
              auVar158._4_4_ = fVar136;
              auVar158._0_4_ = fVar136;
              auVar158._8_4_ = fVar136;
              auVar158._12_4_ = fVar136;
              auVar69 = vfmadd132ps_fma(auVar158,auVar69,local_8a0._0_16_);
              fVar136 = local_7c0._0_4_ * 6.0;
              auVar189._4_4_ = fVar136;
              auVar189._0_4_ = fVar136;
              auVar189._8_4_ = fVar136;
              auVar189._12_4_ = fVar136;
              auVar69 = vfmadd132ps_fma(auVar189,auVar69,local_860._0_16_);
              auVar159._0_4_ = auVar69._0_4_ * (float)local_800._0_4_;
              auVar159._4_4_ = auVar69._4_4_ * (float)local_800._0_4_;
              auVar159._8_4_ = auVar69._8_4_ * (float)local_800._0_4_;
              auVar159._12_4_ = auVar69._12_4_ * (float)local_800._0_4_;
              auVar69 = vdpps_avx(auVar66,auVar69,0x7f);
              fVar136 = auVar69._0_4_;
              auVar190._0_4_ = auVar66._0_4_ * fVar136;
              auVar190._4_4_ = auVar66._4_4_ * fVar136;
              auVar190._8_4_ = auVar66._8_4_ * fVar136;
              auVar190._12_4_ = auVar66._12_4_ * fVar136;
              auVar69 = vsubps_avx(auVar159,auVar190);
              fVar136 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar228 = vmaxss_avx(ZEXT416((uint)fVar164),
                                    ZEXT416((uint)(local_780._0_4_ * fVar151 * 1.9073486e-06)));
              auVar191._0_4_ = auVar69._0_4_ * fVar136;
              auVar191._4_4_ = auVar69._4_4_ * fVar136;
              auVar191._8_4_ = auVar69._8_4_ * fVar136;
              auVar191._12_4_ = auVar69._12_4_ * fVar136;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar66,auVar24);
              auVar78 = vmulps_avx512vl(auVar72,auVar191);
              auVar69 = vdpps_avx(auVar77,auVar71,0x7f);
              auVar72 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar164),auVar228);
              auVar74 = vdpps_avx(auVar70,auVar78,0x7f);
              vfmadd213ss_avx512f(auVar75,ZEXT416((uint)(fVar164 / fVar170)),auVar72);
              fVar136 = auVar69._0_4_ + auVar74._0_4_;
              auVar69 = vdpps_avx(local_990,auVar71,0x7f);
              auVar74 = vdpps_avx(auVar70,auVar77,0x7f);
              auVar72 = vmulss_avx512f(auVar73,auVar67);
              auVar67 = vmulss_avx512f(auVar67,auVar67);
              auVar76 = vaddss_avx512f(auVar76,ZEXT416((uint)(auVar72._0_4_ * auVar67._0_4_)));
              auVar67 = vdpps_avx(auVar70,local_990,0x7f);
              auVar75 = vfnmadd231ss_fma(auVar74,local_9c0._0_16_,ZEXT416((uint)fVar136));
              auVar67 = vfnmadd231ss_fma(auVar67,local_9c0._0_16_,auVar69);
              auVar74 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar168 = fVar168 - auVar74._0_4_;
              auVar72 = vshufps_avx(auVar66,auVar66,0xff);
              auVar74 = vfmsub213ss_fma(auVar75,auVar76,auVar72);
              auVar235._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar67 = ZEXT416((uint)(auVar67._0_4_ * auVar76._0_4_));
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar74._0_4_)),
                                        ZEXT416((uint)fVar136),auVar67);
              auVar74 = vinsertps_avx(auVar235,auVar67,0x1c);
              auVar224._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = auVar69._8_4_ ^ 0x80000000;
              auVar224._12_4_ = auVar69._12_4_ ^ 0x80000000;
              auVar67 = vinsertps_avx(ZEXT416((uint)fVar136),auVar224,0x10);
              auVar209._0_4_ = auVar75._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar69 = vdivps_avx(auVar74,auVar209);
              auVar74 = vdivps_avx(auVar67,auVar209);
              fVar136 = local_9c0._0_4_;
              auVar210._0_4_ = fVar136 * auVar69._0_4_ + fVar168 * auVar74._0_4_;
              auVar210._4_4_ = fVar136 * auVar69._4_4_ + fVar168 * auVar74._4_4_;
              auVar210._8_4_ = fVar136 * auVar69._8_4_ + fVar168 * auVar74._8_4_;
              auVar210._12_4_ = fVar136 * auVar69._12_4_ + fVar168 * auVar74._12_4_;
              auVar69 = vsubps_avx(local_780._0_16_,auVar210);
              auVar150 = ZEXT1664(auVar69);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar74 = vandps_avx512vl(local_9c0._0_16_,auVar25);
              auVar74 = vucomiss_avx512f(auVar74);
              if (!(bool)uVar63 && !(bool)uVar64) {
                auVar74 = vaddss_avx512f(auVar228,auVar74);
                auVar74 = vfmadd231ss_fma(auVar74,local_920,ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar67 = vandps_avx512vl(ZEXT416((uint)fVar168),auVar26);
                if (auVar67._0_4_ < auVar74._0_4_) {
                  bVar62 = uVar60 < 5;
                  fVar151 = auVar69._0_4_ + (float)local_930._0_4_;
                  auVar233 = ZEXT3264(local_a60);
                  auVar237 = ZEXT3264(local_a80);
                  auVar239 = ZEXT3264(local_aa0);
                  if ((fVar248 <= fVar151) &&
                     (fVar164 = *(float *)(ray + k * 4 + 0x200), fVar151 <= fVar164)) {
                    auVar69 = vmovshdup_avx(auVar69);
                    bVar59 = 0;
                    if ((auVar69._0_4_ < 0.0) || (1.0 < auVar69._0_4_)) goto LAB_01a836e1;
                    auVar211._0_12_ = ZEXT812(0);
                    auVar211._12_4_ = 0;
                    auVar192._4_8_ = auVar211._4_8_;
                    auVar192._0_4_ = fVar166;
                    auVar192._12_4_ = 0;
                    auVar69 = vrsqrt14ss_avx512f(auVar211,auVar192);
                    fVar168 = auVar69._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar59 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01a836e1;
                      fVar166 = fVar168 * 1.5 + fVar166 * -0.5 * fVar168 * fVar168 * fVar168;
                      local_b60 = auVar70._0_4_;
                      fStack_b5c = auVar70._4_4_;
                      fStack_b58 = auVar70._8_4_;
                      fStack_b54 = auVar70._12_4_;
                      auVar193._0_4_ = fVar166 * local_b60;
                      auVar193._4_4_ = fVar166 * fStack_b5c;
                      auVar193._8_4_ = fVar166 * fStack_b58;
                      auVar193._12_4_ = fVar166 * fStack_b54;
                      auVar74 = vfmadd213ps_fma(auVar72,auVar193,auVar66);
                      auVar69 = vshufps_avx(auVar193,auVar193,0xc9);
                      auVar70 = vshufps_avx(auVar66,auVar66,0xc9);
                      auVar194._0_4_ = auVar193._0_4_ * auVar70._0_4_;
                      auVar194._4_4_ = auVar193._4_4_ * auVar70._4_4_;
                      auVar194._8_4_ = auVar193._8_4_ * auVar70._8_4_;
                      auVar194._12_4_ = auVar193._12_4_ * auVar70._12_4_;
                      auVar66 = vfmsub231ps_fma(auVar194,auVar66,auVar69);
                      auVar69 = vshufps_avx(auVar66,auVar66,0xc9);
                      auVar70 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar66 = vshufps_avx(auVar66,auVar66,0xd2);
                      auVar143._0_4_ = auVar74._0_4_ * auVar66._0_4_;
                      auVar143._4_4_ = auVar74._4_4_ * auVar66._4_4_;
                      auVar143._8_4_ = auVar74._8_4_ * auVar66._8_4_;
                      auVar143._12_4_ = auVar74._12_4_ * auVar66._12_4_;
                      auVar69 = vfmsub231ps_fma(auVar143,auVar69,auVar70);
                      auVar252 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar252,auVar150);
                      auVar150 = vpermps_avx512f(auVar252,ZEXT1664(auVar69));
                      auVar252 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar252,ZEXT1664(auVar69));
                      local_380 = vbroadcastss_avx512f(auVar69);
                      local_400[0] = (RTCHitN)auVar150[0];
                      local_400[1] = (RTCHitN)auVar150[1];
                      local_400[2] = (RTCHitN)auVar150[2];
                      local_400[3] = (RTCHitN)auVar150[3];
                      local_400[4] = (RTCHitN)auVar150[4];
                      local_400[5] = (RTCHitN)auVar150[5];
                      local_400[6] = (RTCHitN)auVar150[6];
                      local_400[7] = (RTCHitN)auVar150[7];
                      local_400[8] = (RTCHitN)auVar150[8];
                      local_400[9] = (RTCHitN)auVar150[9];
                      local_400[10] = (RTCHitN)auVar150[10];
                      local_400[0xb] = (RTCHitN)auVar150[0xb];
                      local_400[0xc] = (RTCHitN)auVar150[0xc];
                      local_400[0xd] = (RTCHitN)auVar150[0xd];
                      local_400[0xe] = (RTCHitN)auVar150[0xe];
                      local_400[0xf] = (RTCHitN)auVar150[0xf];
                      local_400[0x10] = (RTCHitN)auVar150[0x10];
                      local_400[0x11] = (RTCHitN)auVar150[0x11];
                      local_400[0x12] = (RTCHitN)auVar150[0x12];
                      local_400[0x13] = (RTCHitN)auVar150[0x13];
                      local_400[0x14] = (RTCHitN)auVar150[0x14];
                      local_400[0x15] = (RTCHitN)auVar150[0x15];
                      local_400[0x16] = (RTCHitN)auVar150[0x16];
                      local_400[0x17] = (RTCHitN)auVar150[0x17];
                      local_400[0x18] = (RTCHitN)auVar150[0x18];
                      local_400[0x19] = (RTCHitN)auVar150[0x19];
                      local_400[0x1a] = (RTCHitN)auVar150[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar150[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar150[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar150[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar150[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar150[0x1f];
                      local_400[0x20] = (RTCHitN)auVar150[0x20];
                      local_400[0x21] = (RTCHitN)auVar150[0x21];
                      local_400[0x22] = (RTCHitN)auVar150[0x22];
                      local_400[0x23] = (RTCHitN)auVar150[0x23];
                      local_400[0x24] = (RTCHitN)auVar150[0x24];
                      local_400[0x25] = (RTCHitN)auVar150[0x25];
                      local_400[0x26] = (RTCHitN)auVar150[0x26];
                      local_400[0x27] = (RTCHitN)auVar150[0x27];
                      local_400[0x28] = (RTCHitN)auVar150[0x28];
                      local_400[0x29] = (RTCHitN)auVar150[0x29];
                      local_400[0x2a] = (RTCHitN)auVar150[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar150[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar150[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar150[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar150[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar150[0x2f];
                      local_400[0x30] = (RTCHitN)auVar150[0x30];
                      local_400[0x31] = (RTCHitN)auVar150[0x31];
                      local_400[0x32] = (RTCHitN)auVar150[0x32];
                      local_400[0x33] = (RTCHitN)auVar150[0x33];
                      local_400[0x34] = (RTCHitN)auVar150[0x34];
                      local_400[0x35] = (RTCHitN)auVar150[0x35];
                      local_400[0x36] = (RTCHitN)auVar150[0x36];
                      local_400[0x37] = (RTCHitN)auVar150[0x37];
                      local_400[0x38] = (RTCHitN)auVar150[0x38];
                      local_400[0x39] = (RTCHitN)auVar150[0x39];
                      local_400[0x3a] = (RTCHitN)auVar150[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar150[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar150[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar150[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar150[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar150[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar150 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar150);
                      vpcmpeqd_avx2(auVar150._0_32_,auVar150._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar151;
                      auVar150 = vmovdqa64_avx512f(local_500);
                      local_6c0 = vmovdqa64_avx512f(auVar150);
                      local_ad0.valid = (int *)local_6c0;
                      local_ad0.geometryUserPtr = pGVar2->userPtr;
                      local_ad0.context = context->user;
                      local_ad0.hit = local_400;
                      local_ad0.N = 0x10;
                      local_780._0_4_ = fVar164;
                      local_ad0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar249 = ZEXT1664(auVar71);
                        (*pGVar2->occlusionFilterN)(&local_ad0);
                        auVar239 = ZEXT3264(local_aa0);
                        auVar237 = ZEXT3264(local_a80);
                        auVar233 = ZEXT3264(local_a60);
                        auVar241 = ZEXT3264(local_a40);
                        auVar247 = ZEXT3264(local_a20);
                        auVar245 = ZEXT3264(local_a00);
                        auVar250 = ZEXT3264(local_9e0);
                        auVar150 = vmovdqa64_avx512f(local_6c0);
                        fVar164 = (float)local_780._0_4_;
                      }
                      uVar12 = vptestmd_avx512f(auVar150,auVar150);
                      if ((short)uVar12 != 0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar249 = ZEXT1664(auVar249._0_16_);
                          (*p_Var3)(&local_ad0);
                          auVar239 = ZEXT3264(local_aa0);
                          auVar237 = ZEXT3264(local_a80);
                          auVar233 = ZEXT3264(local_a60);
                          auVar241 = ZEXT3264(local_a40);
                          auVar247 = ZEXT3264(local_a20);
                          auVar245 = ZEXT3264(local_a00);
                          auVar250 = ZEXT3264(local_9e0);
                          auVar150 = vmovdqa64_avx512f(local_6c0);
                          fVar164 = (float)local_780._0_4_;
                        }
                        uVar58 = vptestmd_avx512f(auVar150,auVar150);
                        auVar150 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar58 & 1);
                        auVar252._0_4_ =
                             (uint)bVar4 * auVar150._0_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x200);
                        bVar4 = (bool)((byte)(uVar58 >> 1) & 1);
                        auVar252._4_4_ =
                             (uint)bVar4 * auVar150._4_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x204);
                        bVar4 = (bool)((byte)(uVar58 >> 2) & 1);
                        auVar252._8_4_ =
                             (uint)bVar4 * auVar150._8_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x208);
                        bVar4 = (bool)((byte)(uVar58 >> 3) & 1);
                        auVar252._12_4_ =
                             (uint)bVar4 * auVar150._12_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x20c);
                        bVar4 = (bool)((byte)(uVar58 >> 4) & 1);
                        auVar252._16_4_ =
                             (uint)bVar4 * auVar150._16_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x210);
                        bVar4 = (bool)((byte)(uVar58 >> 5) & 1);
                        auVar252._20_4_ =
                             (uint)bVar4 * auVar150._20_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x214);
                        bVar4 = (bool)((byte)(uVar58 >> 6) & 1);
                        auVar252._24_4_ =
                             (uint)bVar4 * auVar150._24_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x218);
                        bVar4 = (bool)((byte)(uVar58 >> 7) & 1);
                        auVar252._28_4_ =
                             (uint)bVar4 * auVar150._28_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x21c);
                        bVar4 = (bool)((byte)(uVar58 >> 8) & 1);
                        auVar252._32_4_ =
                             (uint)bVar4 * auVar150._32_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x220);
                        bVar4 = (bool)((byte)(uVar58 >> 9) & 1);
                        auVar252._36_4_ =
                             (uint)bVar4 * auVar150._36_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x224);
                        bVar4 = (bool)((byte)(uVar58 >> 10) & 1);
                        auVar252._40_4_ =
                             (uint)bVar4 * auVar150._40_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x228);
                        bVar4 = (bool)((byte)(uVar58 >> 0xb) & 1);
                        auVar252._44_4_ =
                             (uint)bVar4 * auVar150._44_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x22c);
                        bVar4 = (bool)((byte)(uVar58 >> 0xc) & 1);
                        auVar252._48_4_ =
                             (uint)bVar4 * auVar150._48_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x230);
                        bVar4 = (bool)((byte)(uVar58 >> 0xd) & 1);
                        auVar252._52_4_ =
                             (uint)bVar4 * auVar150._52_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x234);
                        bVar4 = (bool)((byte)(uVar58 >> 0xe) & 1);
                        auVar252._56_4_ =
                             (uint)bVar4 * auVar150._56_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x238);
                        bVar4 = SUB81(uVar58 >> 0xf,0);
                        auVar252._60_4_ =
                             (uint)bVar4 * auVar150._60_4_ |
                             (uint)!bVar4 * *(int *)(local_ad0.ray + 0x23c);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x200) = auVar252;
                        bVar59 = 1;
                        if ((short)uVar58 != 0) goto LAB_01a836e1;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar164;
                    }
                  }
                  bVar59 = 0;
                  goto LAB_01a836e1;
                }
              }
              uVar60 = uVar60 + 1;
              auVar233 = ZEXT3264(local_a60);
              auVar237 = ZEXT3264(local_a80);
              auVar239 = ZEXT3264(local_aa0);
            }
            bVar62 = false;
LAB_01a836e1:
            bVar54 = bVar54 | bVar62 & bVar59;
            uVar153 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar227._4_4_ = uVar153;
            auVar227._0_4_ = uVar153;
            auVar227._8_4_ = uVar153;
            auVar227._12_4_ = uVar153;
            auVar227._16_4_ = uVar153;
            auVar227._20_4_ = uVar153;
            auVar227._24_4_ = uVar153;
            auVar227._28_4_ = uVar153;
            auVar150 = ZEXT3264(auVar227);
            auVar49._4_4_ = fStack_65c;
            auVar49._0_4_ = local_660;
            auVar49._8_4_ = fStack_658;
            auVar49._12_4_ = fStack_654;
            auVar49._16_4_ = fStack_650;
            auVar49._20_4_ = fStack_64c;
            auVar49._24_4_ = fStack_648;
            auVar49._28_4_ = fStack_644;
            uVar12 = vcmpps_avx512vl(auVar227,auVar49,0xd);
          }
          uVar14 = vpcmpd_avx512vl(local_620,local_5c0,1);
          uVar13 = vpcmpd_avx512vl(local_620,_local_680,1);
          auVar161._0_4_ = (float)local_980._0_4_ + (float)local_440._0_4_;
          auVar161._4_4_ = (float)local_980._4_4_ + (float)local_440._4_4_;
          auVar161._8_4_ = fStack_978 + fStack_438;
          auVar161._12_4_ = fStack_974 + fStack_434;
          auVar161._16_4_ = fStack_970 + fStack_430;
          auVar161._20_4_ = fStack_96c + fStack_42c;
          auVar161._24_4_ = fStack_968 + fStack_428;
          auVar161._28_4_ = fStack_964 + fStack_424;
          uVar153 = auVar150._0_4_;
          auVar197._4_4_ = uVar153;
          auVar197._0_4_ = uVar153;
          auVar197._8_4_ = uVar153;
          auVar197._12_4_ = uVar153;
          auVar197._16_4_ = uVar153;
          auVar197._20_4_ = uVar153;
          auVar197._24_4_ = uVar153;
          auVar197._28_4_ = uVar153;
          uVar12 = vcmpps_avx512vl(auVar161,auVar197,2);
          bVar56 = bVar56 & (byte)uVar14 & (byte)uVar12;
          auVar213._0_4_ = (float)local_980._0_4_ + (float)local_600._0_4_;
          auVar213._4_4_ = (float)local_980._4_4_ + (float)local_600._4_4_;
          auVar213._8_4_ = fStack_978 + fStack_5f8;
          auVar213._12_4_ = fStack_974 + fStack_5f4;
          auVar213._16_4_ = fStack_970 + fStack_5f0;
          auVar213._20_4_ = fStack_96c + fStack_5ec;
          auVar213._24_4_ = fStack_968 + fStack_5e8;
          auVar213._28_4_ = fStack_964 + fStack_5e4;
          uVar12 = vcmpps_avx512vl(auVar213,auVar197,2);
          bVar51 = bVar51 & (byte)uVar13 & (byte)uVar12 | bVar56;
          if (bVar51 != 0) {
            abStack_1a0[uVar55 * 0x60] = bVar51;
            bVar62 = (bool)(bVar56 >> 1 & 1);
            bVar4 = (bool)(bVar56 >> 2 & 1);
            bVar5 = (bool)(bVar56 >> 3 & 1);
            bVar6 = (bool)(bVar56 >> 4 & 1);
            bVar7 = (bool)(bVar56 >> 5 & 1);
            auStack_180[uVar55 * 0x18] =
                 (uint)(bVar56 & 1) * local_440._0_4_ | (uint)!(bool)(bVar56 & 1) * local_600._0_4_;
            auStack_180[uVar55 * 0x18 + 1] =
                 (uint)bVar62 * local_440._4_4_ | (uint)!bVar62 * local_600._4_4_;
            auStack_180[uVar55 * 0x18 + 2] =
                 (uint)bVar4 * (int)fStack_438 | (uint)!bVar4 * (int)fStack_5f8;
            auStack_180[uVar55 * 0x18 + 3] =
                 (uint)bVar5 * (int)fStack_434 | (uint)!bVar5 * (int)fStack_5f4;
            auStack_180[uVar55 * 0x18 + 4] =
                 (uint)bVar6 * (int)fStack_430 | (uint)!bVar6 * (int)fStack_5f0;
            auStack_180[uVar55 * 0x18 + 5] =
                 (uint)bVar7 * (int)fStack_42c | (uint)!bVar7 * (int)fStack_5ec;
            auStack_180[uVar55 * 0x18 + 6] =
                 (uint)(bVar56 >> 6) * (int)fStack_428 |
                 (uint)!(bool)(bVar56 >> 6) * (int)fStack_5e8;
            (&fStack_164)[uVar55 * 0x18] = fStack_5e4;
            uVar58 = vmovlps_avx(local_630);
            (&uStack_160)[uVar55 * 0xc] = uVar58;
            aiStack_158[uVar55 * 0x18] = local_cdc + 1;
            uVar55 = (ulong)((int)uVar55 + 1);
          }
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar252 = ZEXT3264(auVar91);
          auVar150 = ZEXT3264(_DAT_01f7b040);
          fVar151 = (float)local_980._0_4_;
          fVar164 = (float)local_980._4_4_;
          fVar166 = fStack_978;
          fVar168 = fStack_974;
          fVar136 = fStack_970;
          fVar170 = fStack_96c;
          fVar199 = fStack_968;
          fVar173 = fStack_964;
        }
      }
    }
    do {
      uVar65 = (uint)uVar55;
      uVar55 = (ulong)(uVar65 - 1);
      if (uVar65 == 0) {
        if (bVar54 != 0) goto LAB_01a83db5;
        uVar153 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar33._4_4_ = uVar153;
        auVar33._0_4_ = uVar153;
        auVar33._8_4_ = uVar153;
        auVar33._12_4_ = uVar153;
        auVar33._16_4_ = uVar153;
        auVar33._20_4_ = uVar153;
        auVar33._24_4_ = uVar153;
        auVar33._28_4_ = uVar153;
        uVar12 = vcmpps_avx512vl(local_5a0,auVar33,2);
        uVar61 = (ulong)((uint)local_8c8 & (uint)uVar12);
        goto LAB_01a81441;
      }
      auVar91 = *(undefined1 (*) [32])(auStack_180 + uVar55 * 0x18);
      auVar162._0_4_ = fVar151 + auVar91._0_4_;
      auVar162._4_4_ = fVar164 + auVar91._4_4_;
      auVar162._8_4_ = fVar166 + auVar91._8_4_;
      auVar162._12_4_ = fVar168 + auVar91._12_4_;
      auVar162._16_4_ = fVar136 + auVar91._16_4_;
      auVar162._20_4_ = fVar170 + auVar91._20_4_;
      auVar162._24_4_ = fVar199 + auVar91._24_4_;
      auVar162._28_4_ = fVar173 + auVar91._28_4_;
      uVar153 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar32._4_4_ = uVar153;
      auVar32._0_4_ = uVar153;
      auVar32._8_4_ = uVar153;
      auVar32._12_4_ = uVar153;
      auVar32._16_4_ = uVar153;
      auVar32._20_4_ = uVar153;
      auVar32._24_4_ = uVar153;
      auVar32._28_4_ = uVar153;
      uVar12 = vcmpps_avx512vl(auVar162,auVar32,2);
      uVar128 = (uint)uVar12 & (uint)abStack_1a0[uVar55 * 0x60];
    } while (uVar128 == 0);
    uVar58 = (&uStack_160)[uVar55 * 0xc];
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar58;
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar198,auVar91);
    bVar51 = (byte)uVar128;
    auVar127._0_4_ =
         (uint)(bVar51 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar51 & 1) * (int)auVar91._0_4_;
    bVar62 = (bool)((byte)(uVar128 >> 1) & 1);
    auVar127._4_4_ = (uint)bVar62 * auVar92._4_4_ | (uint)!bVar62 * (int)auVar91._4_4_;
    bVar62 = (bool)((byte)(uVar128 >> 2) & 1);
    auVar127._8_4_ = (uint)bVar62 * auVar92._8_4_ | (uint)!bVar62 * (int)auVar91._8_4_;
    bVar62 = (bool)((byte)(uVar128 >> 3) & 1);
    auVar127._12_4_ = (uint)bVar62 * auVar92._12_4_ | (uint)!bVar62 * (int)auVar91._12_4_;
    bVar62 = (bool)((byte)(uVar128 >> 4) & 1);
    auVar127._16_4_ = (uint)bVar62 * auVar92._16_4_ | (uint)!bVar62 * (int)auVar91._16_4_;
    bVar62 = (bool)((byte)(uVar128 >> 5) & 1);
    auVar127._20_4_ = (uint)bVar62 * auVar92._20_4_ | (uint)!bVar62 * (int)auVar91._20_4_;
    bVar62 = (bool)((byte)(uVar128 >> 6) & 1);
    auVar127._24_4_ = (uint)bVar62 * auVar92._24_4_ | (uint)!bVar62 * (int)auVar91._24_4_;
    auVar127._28_4_ =
         (uVar128 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar128 >> 7,0) * (int)auVar91._28_4_;
    auVar91 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar91 = vminps_avx(auVar127,auVar91);
    auVar92 = vshufpd_avx(auVar91,auVar91,5);
    auVar91 = vminps_avx(auVar91,auVar92);
    auVar92 = vpermpd_avx2(auVar91,0x4e);
    auVar91 = vminps_avx(auVar91,auVar92);
    uVar12 = vcmpps_avx512vl(auVar127,auVar91,0);
    bVar57 = (byte)uVar12 & bVar51;
    if (bVar57 != 0) {
      uVar128 = (uint)bVar57;
    }
    uVar129 = 0;
    for (; (uVar128 & 1) == 0; uVar128 = uVar128 >> 1 | 0x80000000) {
      uVar129 = uVar129 + 1;
    }
    local_cdc = aiStack_158[uVar55 * 0x18];
    bVar51 = ~('\x01' << ((byte)uVar129 & 0x1f)) & bVar51;
    abStack_1a0[uVar55 * 0x60] = bVar51;
    if (bVar51 == 0) {
      uVar65 = uVar65 - 1;
    }
    uVar153 = (undefined4)uVar58;
    auVar149._4_4_ = uVar153;
    auVar149._0_4_ = uVar153;
    auVar149._8_4_ = uVar153;
    auVar149._12_4_ = uVar153;
    auVar149._16_4_ = uVar153;
    auVar149._20_4_ = uVar153;
    auVar149._24_4_ = uVar153;
    auVar149._28_4_ = uVar153;
    auVar69 = vmovshdup_avx(auVar78);
    auVar69 = vsubps_avx(auVar69,auVar78);
    auVar163._0_4_ = auVar69._0_4_;
    auVar163._4_4_ = auVar163._0_4_;
    auVar163._8_4_ = auVar163._0_4_;
    auVar163._12_4_ = auVar163._0_4_;
    auVar163._16_4_ = auVar163._0_4_;
    auVar163._20_4_ = auVar163._0_4_;
    auVar163._24_4_ = auVar163._0_4_;
    auVar163._28_4_ = auVar163._0_4_;
    auVar69 = vfmadd132ps_fma(auVar163,auVar149,auVar150._0_32_);
    auVar91 = ZEXT1632(auVar69);
    local_400[0] = (RTCHitN)auVar91[0];
    local_400[1] = (RTCHitN)auVar91[1];
    local_400[2] = (RTCHitN)auVar91[2];
    local_400[3] = (RTCHitN)auVar91[3];
    local_400[4] = (RTCHitN)auVar91[4];
    local_400[5] = (RTCHitN)auVar91[5];
    local_400[6] = (RTCHitN)auVar91[6];
    local_400[7] = (RTCHitN)auVar91[7];
    local_400[8] = (RTCHitN)auVar91[8];
    local_400[9] = (RTCHitN)auVar91[9];
    local_400[10] = (RTCHitN)auVar91[10];
    local_400[0xb] = (RTCHitN)auVar91[0xb];
    local_400[0xc] = (RTCHitN)auVar91[0xc];
    local_400[0xd] = (RTCHitN)auVar91[0xd];
    local_400[0xe] = (RTCHitN)auVar91[0xe];
    local_400[0xf] = (RTCHitN)auVar91[0xf];
    local_400[0x10] = (RTCHitN)auVar91[0x10];
    local_400[0x11] = (RTCHitN)auVar91[0x11];
    local_400[0x12] = (RTCHitN)auVar91[0x12];
    local_400[0x13] = (RTCHitN)auVar91[0x13];
    local_400[0x14] = (RTCHitN)auVar91[0x14];
    local_400[0x15] = (RTCHitN)auVar91[0x15];
    local_400[0x16] = (RTCHitN)auVar91[0x16];
    local_400[0x17] = (RTCHitN)auVar91[0x17];
    local_400[0x18] = (RTCHitN)auVar91[0x18];
    local_400[0x19] = (RTCHitN)auVar91[0x19];
    local_400[0x1a] = (RTCHitN)auVar91[0x1a];
    local_400[0x1b] = (RTCHitN)auVar91[0x1b];
    local_400[0x1c] = (RTCHitN)auVar91[0x1c];
    local_400[0x1d] = (RTCHitN)auVar91[0x1d];
    local_400[0x1e] = (RTCHitN)auVar91[0x1e];
    local_400[0x1f] = (RTCHitN)auVar91[0x1f];
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_400 + (ulong)uVar129 * 4);
    uVar55 = (ulong)uVar65;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }